

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_t<embree::sse2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  Primitive PVar6;
  int iVar7;
  Geometry *pGVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined6 uVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  int iVar32;
  RTCFilterFunctionN p_Var33;
  byte bVar34;
  long lVar35;
  bool bVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  undefined4 uVar42;
  undefined8 unaff_R15;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  short sVar48;
  float fVar49;
  float fVar82;
  float fVar84;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  float fVar83;
  float fVar85;
  float fVar86;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar87;
  float fVar88;
  float fVar96;
  float fVar98;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar97;
  float fVar99;
  float fVar100;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar101;
  float fVar107;
  float fVar108;
  vfloat4 v;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar109;
  float fVar110;
  float fVar118;
  float fVar120;
  vfloat4 v_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar119;
  float fVar121;
  float fVar122;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar123;
  float fVar135;
  float fVar136;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar137;
  float fVar159;
  float fVar160;
  undefined1 auVar138 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar168;
  float fVar170;
  undefined1 auVar162 [16];
  float fVar169;
  float fVar171;
  float fVar172;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar167;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar179;
  float fVar182;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar180;
  float fVar181;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar178;
  float fVar187;
  float fVar193;
  float fVar194;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar195;
  float fVar197;
  float fVar198;
  undefined1 auVar196 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar206;
  float fVar208;
  float fVar210;
  undefined1 auVar204 [16];
  float fVar207;
  float fVar209;
  float fVar211;
  undefined1 auVar205 [16];
  float fVar212;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar221;
  float fVar226;
  float fVar227;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  int local_43c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_438;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_428;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_418;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  Primitive *local_3b8;
  Ray *local_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  ulong local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  Precalculations *local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  RTCFilterFunctionNArguments args;
  undefined8 local_278;
  float local_270;
  float local_26c;
  float local_268;
  undefined4 local_264;
  undefined4 local_260;
  uint local_25c;
  uint local_258;
  RayQueryContext *local_248;
  ulong local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 uVar80;
  undefined2 uVar81;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  
  PVar6 = prim[1];
  uVar37 = (ulong)(byte)PVar6;
  pPVar5 = prim + uVar37 * 0x19 + 6;
  fVar108 = *(float *)(pPVar5 + 0xc);
  fVar109 = ((ray->org).field_0.m128[0] - *(float *)pPVar5) * fVar108;
  fVar118 = ((ray->org).field_0.m128[1] - *(float *)(pPVar5 + 4)) * fVar108;
  fVar120 = ((ray->org).field_0.m128[2] - *(float *)(pPVar5 + 8)) * fVar108;
  fVar101 = fVar108 * (ray->dir).field_0.m128[0];
  fVar107 = fVar108 * (ray->dir).field_0.m128[1];
  fVar108 = fVar108 * (ray->dir).field_0.m128[2];
  uVar42 = *(undefined4 *)(prim + uVar37 * 4 + 6);
  uVar80 = (undefined1)((uint)uVar42 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar42 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar42));
  uVar80 = (undefined1)((uint)uVar42 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar80),uVar80);
  sVar48 = CONCAT11((char)uVar42,(char)uVar42);
  uVar41 = CONCAT62(uVar12,sVar48);
  auVar50._8_4_ = 0;
  auVar50._0_8_ = uVar41;
  auVar50._12_2_ = uVar81;
  auVar50._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar190._12_4_ = auVar50._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar41;
  auVar190._10_2_ = uVar81;
  auVar60._10_6_ = auVar190._10_6_;
  auVar60._8_2_ = uVar81;
  auVar60._0_8_ = uVar41;
  uVar81 = (undefined2)uVar12;
  auVar13._4_8_ = auVar60._8_8_;
  auVar13._2_2_ = uVar81;
  auVar13._0_2_ = uVar81;
  fVar87 = (float)((int)sVar48 >> 8);
  fVar96 = (float)(auVar13._0_4_ >> 0x18);
  fVar98 = (float)(auVar60._8_4_ >> 0x18);
  uVar42 = *(undefined4 *)(prim + uVar37 * 5 + 6);
  uVar80 = (undefined1)((uint)uVar42 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar42 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar42));
  uVar80 = (undefined1)((uint)uVar42 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar80),uVar80);
  sVar48 = CONCAT11((char)uVar42,(char)uVar42);
  uVar41 = CONCAT62(uVar12,sVar48);
  auVar53._8_4_ = 0;
  auVar53._0_8_ = uVar41;
  auVar53._12_2_ = uVar81;
  auVar53._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar52._12_4_ = auVar53._12_4_;
  auVar52._8_2_ = 0;
  auVar52._0_8_ = uVar41;
  auVar52._10_2_ = uVar81;
  auVar51._10_6_ = auVar52._10_6_;
  auVar51._8_2_ = uVar81;
  auVar51._0_8_ = uVar41;
  uVar81 = (undefined2)uVar12;
  auVar14._4_8_ = auVar51._8_8_;
  auVar14._2_2_ = uVar81;
  auVar14._0_2_ = uVar81;
  fVar123 = (float)((int)sVar48 >> 8);
  fVar135 = (float)(auVar14._0_4_ >> 0x18);
  fVar136 = (float)(auVar51._8_4_ >> 0x18);
  uVar42 = *(undefined4 *)(prim + uVar37 * 6 + 6);
  uVar80 = (undefined1)((uint)uVar42 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar42 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar42));
  uVar80 = (undefined1)((uint)uVar42 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar80),uVar80);
  sVar48 = CONCAT11((char)uVar42,(char)uVar42);
  uVar41 = CONCAT62(uVar12,sVar48);
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar41;
  auVar56._12_2_ = uVar81;
  auVar56._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._8_2_ = 0;
  auVar55._0_8_ = uVar41;
  auVar55._10_2_ = uVar81;
  auVar54._10_6_ = auVar55._10_6_;
  auVar54._8_2_ = uVar81;
  auVar54._0_8_ = uVar41;
  uVar81 = (undefined2)uVar12;
  auVar15._4_8_ = auVar54._8_8_;
  auVar15._2_2_ = uVar81;
  auVar15._0_2_ = uVar81;
  fVar173 = (float)((int)sVar48 >> 8);
  fVar179 = (float)(auVar15._0_4_ >> 0x18);
  fVar182 = (float)(auVar54._8_4_ >> 0x18);
  uVar42 = *(undefined4 *)(prim + uVar37 * 0xb + 6);
  uVar80 = (undefined1)((uint)uVar42 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar42 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar42));
  uVar80 = (undefined1)((uint)uVar42 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar80),uVar80);
  sVar48 = CONCAT11((char)uVar42,(char)uVar42);
  uVar41 = CONCAT62(uVar12,sVar48);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar41;
  auVar59._12_2_ = uVar81;
  auVar59._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar41;
  auVar58._10_2_ = uVar81;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar81;
  auVar57._0_8_ = uVar41;
  uVar81 = (undefined2)uVar12;
  auVar16._4_8_ = auVar57._8_8_;
  auVar16._2_2_ = uVar81;
  auVar16._0_2_ = uVar81;
  fVar49 = (float)((int)sVar48 >> 8);
  fVar82 = (float)(auVar16._0_4_ >> 0x18);
  fVar84 = (float)(auVar57._8_4_ >> 0x18);
  uVar42 = *(undefined4 *)(prim + uVar37 * 0xc + 6);
  uVar80 = (undefined1)((uint)uVar42 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar42 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar42));
  uVar80 = (undefined1)((uint)uVar42 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar80),uVar80);
  sVar48 = CONCAT11((char)uVar42,(char)uVar42);
  uVar41 = CONCAT62(uVar12,sVar48);
  auVar140._8_4_ = 0;
  auVar140._0_8_ = uVar41;
  auVar140._12_2_ = uVar81;
  auVar140._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar139._12_4_ = auVar140._12_4_;
  auVar139._8_2_ = 0;
  auVar139._0_8_ = uVar41;
  auVar139._10_2_ = uVar81;
  auVar138._10_6_ = auVar139._10_6_;
  auVar138._8_2_ = uVar81;
  auVar138._0_8_ = uVar41;
  uVar81 = (undefined2)uVar12;
  auVar17._4_8_ = auVar138._8_8_;
  auVar17._2_2_ = uVar81;
  auVar17._0_2_ = uVar81;
  fVar161 = (float)((int)sVar48 >> 8);
  fVar168 = (float)(auVar17._0_4_ >> 0x18);
  fVar170 = (float)(auVar138._8_4_ >> 0x18);
  uVar42 = *(undefined4 *)(prim + uVar37 * 0xd + 6);
  uVar80 = (undefined1)((uint)uVar42 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar42 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar42));
  uVar80 = (undefined1)((uint)uVar42 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar80),uVar80);
  sVar48 = CONCAT11((char)uVar42,(char)uVar42);
  uVar41 = CONCAT62(uVar12,sVar48);
  auVar143._8_4_ = 0;
  auVar143._0_8_ = uVar41;
  auVar143._12_2_ = uVar81;
  auVar143._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._8_2_ = 0;
  auVar142._0_8_ = uVar41;
  auVar142._10_2_ = uVar81;
  auVar141._10_6_ = auVar142._10_6_;
  auVar141._8_2_ = uVar81;
  auVar141._0_8_ = uVar41;
  uVar81 = (undefined2)uVar12;
  auVar18._4_8_ = auVar141._8_8_;
  auVar18._2_2_ = uVar81;
  auVar18._0_2_ = uVar81;
  fVar195 = (float)((int)sVar48 >> 8);
  fVar197 = (float)(auVar18._0_4_ >> 0x18);
  fVar198 = (float)(auVar141._8_4_ >> 0x18);
  uVar42 = *(undefined4 *)(prim + uVar37 * 0x12 + 6);
  uVar80 = (undefined1)((uint)uVar42 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar42 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar42));
  uVar80 = (undefined1)((uint)uVar42 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar80),uVar80);
  sVar48 = CONCAT11((char)uVar42,(char)uVar42);
  uVar41 = CONCAT62(uVar12,sVar48);
  auVar146._8_4_ = 0;
  auVar146._0_8_ = uVar41;
  auVar146._12_2_ = uVar81;
  auVar146._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar145._12_4_ = auVar146._12_4_;
  auVar145._8_2_ = 0;
  auVar145._0_8_ = uVar41;
  auVar145._10_2_ = uVar81;
  auVar144._10_6_ = auVar145._10_6_;
  auVar144._8_2_ = uVar81;
  auVar144._0_8_ = uVar41;
  uVar81 = (undefined2)uVar12;
  auVar19._4_8_ = auVar144._8_8_;
  auVar19._2_2_ = uVar81;
  auVar19._0_2_ = uVar81;
  fVar187 = (float)((int)sVar48 >> 8);
  fVar193 = (float)(auVar19._0_4_ >> 0x18);
  fVar194 = (float)(auVar144._8_4_ >> 0x18);
  uVar42 = *(undefined4 *)(prim + uVar37 * 0x13 + 6);
  uVar80 = (undefined1)((uint)uVar42 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar42 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar42));
  uVar80 = (undefined1)((uint)uVar42 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar80),uVar80);
  sVar48 = CONCAT11((char)uVar42,(char)uVar42);
  uVar41 = CONCAT62(uVar12,sVar48);
  auVar149._8_4_ = 0;
  auVar149._0_8_ = uVar41;
  auVar149._12_2_ = uVar81;
  auVar149._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._8_2_ = 0;
  auVar148._0_8_ = uVar41;
  auVar148._10_2_ = uVar81;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._8_2_ = uVar81;
  auVar147._0_8_ = uVar41;
  uVar81 = (undefined2)uVar12;
  auVar20._4_8_ = auVar147._8_8_;
  auVar20._2_2_ = uVar81;
  auVar20._0_2_ = uVar81;
  fVar199 = (float)((int)sVar48 >> 8);
  fVar200 = (float)(auVar20._0_4_ >> 0x18);
  fVar201 = (float)(auVar147._8_4_ >> 0x18);
  uVar42 = *(undefined4 *)(prim + uVar37 * 0x14 + 6);
  uVar80 = (undefined1)((uint)uVar42 >> 0x18);
  uVar81 = CONCAT11(uVar80,uVar80);
  uVar80 = (undefined1)((uint)uVar42 >> 0x10);
  uVar10 = CONCAT35(CONCAT21(uVar81,uVar80),CONCAT14(uVar80,uVar42));
  uVar80 = (undefined1)((uint)uVar42 >> 8);
  uVar12 = CONCAT51(CONCAT41((int)((ulong)uVar10 >> 0x20),uVar80),uVar80);
  sVar48 = CONCAT11((char)uVar42,(char)uVar42);
  uVar41 = CONCAT62(uVar12,sVar48);
  auVar152._8_4_ = 0;
  auVar152._0_8_ = uVar41;
  auVar152._12_2_ = uVar81;
  auVar152._14_2_ = uVar81;
  uVar81 = (undefined2)((ulong)uVar10 >> 0x20);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar41;
  auVar151._10_2_ = uVar81;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = uVar81;
  auVar150._0_8_ = uVar41;
  uVar81 = (undefined2)uVar12;
  auVar21._4_8_ = auVar150._8_8_;
  auVar21._2_2_ = uVar81;
  auVar21._0_2_ = uVar81;
  fVar221 = (float)((int)sVar48 >> 8);
  fVar226 = (float)(auVar21._0_4_ >> 0x18);
  fVar227 = (float)(auVar150._8_4_ >> 0x18);
  fVar212 = fVar101 * fVar87 + fVar107 * fVar123 + fVar108 * fVar173;
  fVar218 = fVar101 * fVar96 + fVar107 * fVar135 + fVar108 * fVar179;
  fVar219 = fVar101 * fVar98 + fVar107 * fVar136 + fVar108 * fVar182;
  fVar220 = fVar101 * (float)(auVar190._12_4_ >> 0x18) +
            fVar107 * (float)(auVar52._12_4_ >> 0x18) + fVar108 * (float)(auVar55._12_4_ >> 0x18);
  fVar202 = fVar101 * fVar49 + fVar107 * fVar161 + fVar108 * fVar195;
  fVar206 = fVar101 * fVar82 + fVar107 * fVar168 + fVar108 * fVar197;
  fVar208 = fVar101 * fVar84 + fVar107 * fVar170 + fVar108 * fVar198;
  fVar210 = fVar101 * (float)(auVar58._12_4_ >> 0x18) +
            fVar107 * (float)(auVar139._12_4_ >> 0x18) + fVar108 * (float)(auVar142._12_4_ >> 0x18);
  fVar137 = fVar101 * fVar187 + fVar107 * fVar199 + fVar108 * fVar221;
  fVar159 = fVar101 * fVar193 + fVar107 * fVar200 + fVar108 * fVar226;
  fVar160 = fVar101 * fVar194 + fVar107 * fVar201 + fVar108 * fVar227;
  fVar101 = fVar101 * (float)(auVar145._12_4_ >> 0x18) +
            fVar107 * (float)(auVar148._12_4_ >> 0x18) + fVar108 * (float)(auVar151._12_4_ >> 0x18);
  fVar123 = fVar87 * fVar109 + fVar123 * fVar118 + fVar173 * fVar120;
  fVar135 = fVar96 * fVar109 + fVar135 * fVar118 + fVar179 * fVar120;
  fVar136 = fVar98 * fVar109 + fVar136 * fVar118 + fVar182 * fVar120;
  fVar173 = (float)(auVar190._12_4_ >> 0x18) * fVar109 +
            (float)(auVar52._12_4_ >> 0x18) * fVar118 + (float)(auVar55._12_4_ >> 0x18) * fVar120;
  fVar182 = fVar49 * fVar109 + fVar161 * fVar118 + fVar195 * fVar120;
  fVar195 = fVar82 * fVar109 + fVar168 * fVar118 + fVar197 * fVar120;
  fVar197 = fVar84 * fVar109 + fVar170 * fVar118 + fVar198 * fVar120;
  fVar198 = (float)(auVar58._12_4_ >> 0x18) * fVar109 +
            (float)(auVar139._12_4_ >> 0x18) * fVar118 + (float)(auVar142._12_4_ >> 0x18) * fVar120;
  fVar161 = fVar109 * fVar187 + fVar118 * fVar199 + fVar120 * fVar221;
  fVar168 = fVar109 * fVar193 + fVar118 * fVar200 + fVar120 * fVar226;
  fVar170 = fVar109 * fVar194 + fVar118 * fVar201 + fVar120 * fVar227;
  fVar179 = fVar109 * (float)(auVar145._12_4_ >> 0x18) +
            fVar118 * (float)(auVar148._12_4_ >> 0x18) + fVar120 * (float)(auVar151._12_4_ >> 0x18);
  fVar108 = (float)DAT_01f4bd50;
  fVar49 = DAT_01f4bd50._4_4_;
  fVar82 = DAT_01f4bd50._8_4_;
  fVar84 = DAT_01f4bd50._12_4_;
  uVar43 = -(uint)(fVar108 <= ABS(fVar212));
  uVar44 = -(uint)(fVar49 <= ABS(fVar218));
  uVar45 = -(uint)(fVar82 <= ABS(fVar219));
  uVar46 = -(uint)(fVar84 <= ABS(fVar220));
  auVar213._0_4_ = (uint)fVar212 & uVar43;
  auVar213._4_4_ = (uint)fVar218 & uVar44;
  auVar213._8_4_ = (uint)fVar219 & uVar45;
  auVar213._12_4_ = (uint)fVar220 & uVar46;
  auVar111._0_4_ = ~uVar43 & (uint)fVar108;
  auVar111._4_4_ = ~uVar44 & (uint)fVar49;
  auVar111._8_4_ = ~uVar45 & (uint)fVar82;
  auVar111._12_4_ = ~uVar46 & (uint)fVar84;
  auVar111 = auVar111 | auVar213;
  uVar43 = -(uint)(fVar108 <= ABS(fVar202));
  uVar44 = -(uint)(fVar49 <= ABS(fVar206));
  uVar45 = -(uint)(fVar82 <= ABS(fVar208));
  uVar46 = -(uint)(fVar84 <= ABS(fVar210));
  auVar204._0_4_ = (uint)fVar202 & uVar43;
  auVar204._4_4_ = (uint)fVar206 & uVar44;
  auVar204._8_4_ = (uint)fVar208 & uVar45;
  auVar204._12_4_ = (uint)fVar210 & uVar46;
  auVar124._0_4_ = ~uVar43 & (uint)fVar108;
  auVar124._4_4_ = ~uVar44 & (uint)fVar49;
  auVar124._8_4_ = ~uVar45 & (uint)fVar82;
  auVar124._12_4_ = ~uVar46 & (uint)fVar84;
  auVar124 = auVar124 | auVar204;
  uVar43 = -(uint)(fVar108 <= ABS(fVar137));
  uVar44 = -(uint)(fVar49 <= ABS(fVar159));
  uVar45 = -(uint)(fVar82 <= ABS(fVar160));
  uVar46 = -(uint)(fVar84 <= ABS(fVar101));
  auVar153._0_4_ = (uint)fVar137 & uVar43;
  auVar153._4_4_ = (uint)fVar159 & uVar44;
  auVar153._8_4_ = (uint)fVar160 & uVar45;
  auVar153._12_4_ = (uint)fVar101 & uVar46;
  auVar188._0_4_ = ~uVar43 & (uint)fVar108;
  auVar188._4_4_ = ~uVar44 & (uint)fVar49;
  auVar188._8_4_ = ~uVar45 & (uint)fVar82;
  auVar188._12_4_ = ~uVar46 & (uint)fVar84;
  auVar188 = auVar188 | auVar153;
  auVar60 = rcpps(_DAT_01f4bd50,auVar111);
  fVar108 = auVar60._0_4_;
  fVar84 = auVar60._4_4_;
  fVar98 = auVar60._8_4_;
  fVar109 = auVar60._12_4_;
  fVar108 = (1.0 - auVar111._0_4_ * fVar108) * fVar108 + fVar108;
  fVar84 = (1.0 - auVar111._4_4_ * fVar84) * fVar84 + fVar84;
  fVar98 = (1.0 - auVar111._8_4_ * fVar98) * fVar98 + fVar98;
  fVar109 = (1.0 - auVar111._12_4_ * fVar109) * fVar109 + fVar109;
  auVar60 = rcpps(auVar60,auVar124);
  fVar49 = auVar60._0_4_;
  fVar87 = auVar60._4_4_;
  fVar101 = auVar60._8_4_;
  fVar118 = auVar60._12_4_;
  fVar49 = (1.0 - auVar124._0_4_ * fVar49) * fVar49 + fVar49;
  fVar87 = (1.0 - auVar124._4_4_ * fVar87) * fVar87 + fVar87;
  fVar101 = (1.0 - auVar124._8_4_ * fVar101) * fVar101 + fVar101;
  fVar118 = (1.0 - auVar124._12_4_ * fVar118) * fVar118 + fVar118;
  auVar60 = rcpps(auVar60,auVar188);
  fVar82 = auVar60._0_4_;
  fVar96 = auVar60._4_4_;
  fVar107 = auVar60._8_4_;
  fVar120 = auVar60._12_4_;
  fVar82 = (1.0 - auVar188._0_4_ * fVar82) * fVar82 + fVar82;
  fVar96 = (1.0 - auVar188._4_4_ * fVar96) * fVar96 + fVar96;
  fVar107 = (1.0 - auVar188._8_4_ * fVar107) * fVar107 + fVar107;
  fVar120 = (1.0 - auVar188._12_4_ * fVar120) * fVar120 + fVar120;
  uVar41 = *(ulong *)(prim + uVar37 * 7 + 6);
  uVar81 = (undefined2)(uVar41 >> 0x30);
  auVar63._8_4_ = 0;
  auVar63._0_8_ = uVar41;
  auVar63._12_2_ = uVar81;
  auVar63._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar41 >> 0x20);
  auVar62._12_4_ = auVar63._12_4_;
  auVar62._8_2_ = 0;
  auVar62._0_8_ = uVar41;
  auVar62._10_2_ = uVar81;
  auVar61._10_6_ = auVar62._10_6_;
  auVar61._8_2_ = uVar81;
  auVar61._0_8_ = uVar41;
  uVar81 = (undefined2)(uVar41 >> 0x10);
  auVar22._4_8_ = auVar61._8_8_;
  auVar22._2_2_ = uVar81;
  auVar22._0_2_ = uVar81;
  auVar112._0_8_ =
       CONCAT44(((float)(auVar22._0_4_ >> 0x10) - fVar135) * fVar84,
                ((float)(int)(short)uVar41 - fVar123) * fVar108);
  auVar112._8_4_ = ((float)(auVar61._8_4_ >> 0x10) - fVar136) * fVar98;
  auVar112._12_4_ = ((float)(auVar62._12_4_ >> 0x10) - fVar173) * fVar109;
  uVar41 = *(ulong *)(prim + uVar37 * 9 + 6);
  uVar81 = (undefined2)(uVar41 >> 0x30);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar41;
  auVar66._12_2_ = uVar81;
  auVar66._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar41 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar41;
  auVar65._10_2_ = uVar81;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar81;
  auVar64._0_8_ = uVar41;
  uVar81 = (undefined2)(uVar41 >> 0x10);
  auVar23._4_8_ = auVar64._8_8_;
  auVar23._2_2_ = uVar81;
  auVar23._0_2_ = uVar81;
  local_428._0_4_ = ((float)(int)(short)uVar41 - fVar123) * fVar108;
  local_428._4_4_ = ((float)(auVar23._0_4_ >> 0x10) - fVar135) * fVar84;
  local_428._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar136) * fVar98;
  local_428._12_4_ = ((float)(auVar65._12_4_ >> 0x10) - fVar173) * fVar109;
  uVar41 = *(ulong *)(prim + uVar37 * 0xe + 6);
  uVar81 = (undefined2)(uVar41 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar41;
  auVar69._12_2_ = uVar81;
  auVar69._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar41 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar41;
  auVar68._10_2_ = uVar81;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar81;
  auVar67._0_8_ = uVar41;
  uVar81 = (undefined2)(uVar41 >> 0x10);
  auVar24._4_8_ = auVar67._8_8_;
  auVar24._2_2_ = uVar81;
  auVar24._0_2_ = uVar81;
  auVar89._0_8_ =
       CONCAT44(((float)(auVar24._0_4_ >> 0x10) - fVar195) * fVar87,
                ((float)(int)(short)uVar41 - fVar182) * fVar49);
  auVar89._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar197) * fVar101;
  auVar89._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar198) * fVar118;
  uVar41 = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  uVar81 = (undefined2)(uVar41 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar41;
  auVar72._12_2_ = uVar81;
  auVar72._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar41 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar41;
  auVar71._10_2_ = uVar81;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar81;
  auVar70._0_8_ = uVar41;
  uVar81 = (undefined2)(uVar41 >> 0x10);
  auVar25._4_8_ = auVar70._8_8_;
  auVar25._2_2_ = uVar81;
  auVar25._0_2_ = uVar81;
  local_438._0_4_ = ((float)(int)(short)uVar41 - fVar182) * fVar49;
  local_438._4_4_ = ((float)(auVar25._0_4_ >> 0x10) - fVar195) * fVar87;
  local_438._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar197) * fVar101;
  local_438._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar198) * fVar118;
  uVar41 = *(ulong *)(prim + uVar37 * 0x15 + 6);
  uVar81 = (undefined2)(uVar41 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar41;
  auVar75._12_2_ = uVar81;
  auVar75._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar41 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar41;
  auVar74._10_2_ = uVar81;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar81;
  auVar73._0_8_ = uVar41;
  uVar81 = (undefined2)(uVar41 >> 0x10);
  auVar26._4_8_ = auVar73._8_8_;
  auVar26._2_2_ = uVar81;
  auVar26._0_2_ = uVar81;
  auVar76._0_8_ =
       CONCAT44(((float)(auVar26._0_4_ >> 0x10) - fVar168) * fVar96,
                ((float)(int)(short)uVar41 - fVar161) * fVar82);
  auVar76._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar170) * fVar107;
  auVar76._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar179) * fVar120;
  uVar41 = *(ulong *)(prim + uVar37 * 0x17 + 6);
  uVar81 = (undefined2)(uVar41 >> 0x30);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar41;
  auVar164._12_2_ = uVar81;
  auVar164._14_2_ = uVar81;
  uVar81 = (undefined2)(uVar41 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar41;
  auVar163._10_2_ = uVar81;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar81;
  auVar162._0_8_ = uVar41;
  uVar81 = (undefined2)(uVar41 >> 0x10);
  auVar27._4_8_ = auVar162._8_8_;
  auVar27._2_2_ = uVar81;
  auVar27._0_2_ = uVar81;
  local_418._0_4_ = ((float)(int)(short)uVar41 - fVar161) * fVar82;
  local_418._4_4_ = ((float)(auVar27._0_4_ >> 0x10) - fVar168) * fVar96;
  local_418._8_4_ = ((float)(auVar162._8_4_ >> 0x10) - fVar170) * fVar107;
  local_418._12_4_ = ((float)(auVar163._12_4_ >> 0x10) - fVar179) * fVar120;
  auVar189._8_4_ = auVar112._8_4_;
  auVar189._0_8_ = auVar112._0_8_;
  auVar189._12_4_ = auVar112._12_4_;
  auVar190 = minps(auVar189,(undefined1  [16])local_428);
  auVar102._8_4_ = auVar89._8_4_;
  auVar102._0_8_ = auVar89._0_8_;
  auVar102._12_4_ = auVar89._12_4_;
  auVar60 = minps(auVar102,(undefined1  [16])local_438);
  auVar190 = maxps(auVar190,auVar60);
  auVar103._8_4_ = auVar76._8_4_;
  auVar103._0_8_ = auVar76._0_8_;
  auVar103._12_4_ = auVar76._12_4_;
  auVar60 = minps(auVar103,(undefined1  [16])local_418);
  uVar42 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar125._4_4_ = uVar42;
  auVar125._0_4_ = uVar42;
  auVar125._8_4_ = uVar42;
  auVar125._12_4_ = uVar42;
  auVar60 = maxps(auVar60,auVar125);
  auVar60 = maxps(auVar190,auVar60);
  fVar49 = auVar60._0_4_ * 0.99999964;
  fVar82 = auVar60._4_4_ * 0.99999964;
  fVar84 = auVar60._8_4_ * 0.99999964;
  fVar87 = auVar60._12_4_ * 0.99999964;
  auVar190 = maxps(auVar112,(undefined1  [16])local_428);
  auVar60 = maxps(auVar89,(undefined1  [16])local_438);
  auVar190 = minps(auVar190,auVar60);
  auVar60 = maxps(auVar76,(undefined1  [16])local_418);
  fVar108 = ray->tfar;
  auVar90._4_4_ = fVar108;
  auVar90._0_4_ = fVar108;
  auVar90._8_4_ = fVar108;
  auVar90._12_4_ = fVar108;
  auVar60 = minps(auVar60,auVar90);
  auVar60 = minps(auVar190,auVar60);
  local_408 = auVar60._0_4_ * 1.0000004;
  fStack_404 = auVar60._4_4_ * 1.0000004;
  fStack_400 = auVar60._8_4_ * 1.0000004;
  fStack_3fc = auVar60._12_4_ * 1.0000004;
  local_300 = pre;
  auVar91._0_4_ = -(uint)(PVar6 != (Primitive)0x0 && fVar49 <= local_408);
  auVar91._4_4_ = -(uint)(1 < (byte)PVar6 && fVar82 <= fStack_404);
  auVar91._8_4_ = -(uint)(2 < (byte)PVar6 && fVar84 <= fStack_400);
  auVar91._12_4_ = -(uint)(3 < (byte)PVar6 && fVar87 <= fStack_3fc);
  uVar42 = movmskps((int)unaff_R15,auVar91);
  local_2f8 = mm_lookupmask_ps._0_8_;
  uStack_2f0 = mm_lookupmask_ps._8_8_;
  uVar41 = CONCAT44((int)((ulong)unaff_R15 >> 0x20),uVar42);
  local_3b0 = ray;
  local_3b8 = prim;
  while (uVar41 != 0) {
    lVar39 = 0;
    if (uVar41 != 0) {
      for (; (uVar41 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
      }
    }
    uVar40 = uVar41 - 1 & uVar41;
    local_360 = (ulong)*(uint *)(local_3b8 + 2);
    pGVar8 = (context->scene->geometries).items[*(uint *)(local_3b8 + 2)].ptr;
    local_240 = (ulong)*(uint *)(local_3b8 + lVar39 * 4 + 6);
    uVar37 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)*(uint *)(local_3b8 + lVar39 * 4 + 6));
    p_Var33 = pGVar8[1].intersectionFilterN;
    lVar39 = *(long *)&pGVar8[1].time_range.upper;
    pfVar1 = (float *)(lVar39 + (long)p_Var33 * uVar37);
    fStack_370 = pfVar1[2];
    fStack_36c = pfVar1[3];
    pfVar2 = (float *)(lVar39 + (uVar37 + 1) * (long)p_Var33);
    fStack_220 = pfVar2[2];
    fStack_21c = pfVar2[3];
    pfVar3 = (float *)(lVar39 + (uVar37 + 2) * (long)p_Var33);
    fStack_340 = pfVar3[2];
    fStack_33c = pfVar3[3];
    lVar38 = 0;
    if (uVar40 != 0) {
      for (; (uVar40 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
      }
    }
    pfVar4 = (float *)(lVar39 + (uVar37 + 3) * (long)p_Var33);
    fStack_350 = pfVar4[2];
    fVar108 = pfVar4[3];
    if (((uVar40 != 0) && (uVar37 = uVar40 - 1 & uVar40, uVar37 != 0)) && (lVar39 = 0, uVar37 != 0))
    {
      for (; (uVar37 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
      }
    }
    iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar96 = (local_3b0->org).field_0.m128[0];
    fVar98 = (local_3b0->org).field_0.m128[1];
    fVar101 = (local_3b0->org).field_0.m128[2];
    local_208 = (local_3b0->org).field_0.m128[3];
    local_378 = *pfVar1;
    fStack_374 = pfVar1[1];
    fVar168 = *pfVar1 - fVar96;
    fVar170 = pfVar1[1] - fVar98;
    fVar179 = fStack_370 - fVar101;
    fVar107 = (local_300->ray_space).vx.field_0.m128[0];
    fVar109 = (local_300->ray_space).vx.field_0.m128[1];
    fVar118 = (local_300->ray_space).vx.field_0.m128[2];
    fVar120 = (local_300->ray_space).vy.field_0.m128[0];
    fVar123 = (local_300->ray_space).vy.field_0.m128[1];
    fVar135 = (local_300->ray_space).vy.field_0.m128[2];
    fVar136 = (local_300->ray_space).vz.field_0.m128[0];
    fVar173 = (local_300->ray_space).vz.field_0.m128[1];
    fVar161 = (local_300->ray_space).vz.field_0.m128[2];
    local_218 = fVar168 * fVar107 + fVar170 * fVar120 + fVar179 * fVar136;
    local_1a8 = fVar168 * fVar109 + fVar170 * fVar123 + fVar179 * fVar173;
    local_398 = fVar168 * fVar118 + fVar170 * fVar135 + fVar179 * fVar161;
    fVar168 = *pfVar2 - fVar96;
    fVar170 = pfVar2[1] - fVar98;
    fVar179 = fStack_220 - fVar101;
    fVar137 = fVar168 * fVar107 + fVar170 * fVar120 + fVar179 * fVar136;
    local_198 = fVar168 * fVar109 + fVar170 * fVar123 + fVar179 * fVar173;
    local_318 = fVar168 * fVar118 + fVar170 * fVar135 + fVar179 * fVar161;
    fVar168 = *pfVar3 - fVar96;
    fVar170 = pfVar3[1] - fVar98;
    fVar179 = fStack_340 - fVar101;
    local_3d8 = fVar168 * fVar107 + fVar170 * fVar120 + fVar179 * fVar136;
    local_3c8 = fVar168 * fVar109 + fVar170 * fVar123 + fVar179 * fVar173;
    local_1f8 = fVar168 * fVar118 + fVar170 * fVar135 + fVar179 * fVar161;
    fVar96 = *pfVar4 - fVar96;
    fVar98 = pfVar4[1] - fVar98;
    fVar101 = fStack_350 - fVar101;
    fVar107 = fVar96 * fVar107 + fVar98 * fVar120 + fVar101 * fVar136;
    fVar109 = fVar96 * fVar109 + fVar98 * fVar123 + fVar101 * fVar173;
    local_3a8 = fVar96 * fVar118 + fVar98 * fVar135 + fVar101 * fVar161;
    auVar176._0_8_ = CONCAT44(local_1a8,local_218) & 0x7fffffff7fffffff;
    auVar176._8_4_ = ABS(local_398);
    auVar176._12_4_ = ABS(fStack_36c);
    auVar113._0_8_ = CONCAT44(local_198,fVar137) & 0x7fffffff7fffffff;
    auVar113._8_4_ = ABS(local_318);
    auVar113._12_4_ = ABS(fStack_21c);
    auVar190 = maxps(auVar176,auVar113);
    auVar126._0_8_ = CONCAT44(local_3c8,local_3d8) & 0x7fffffff7fffffff;
    auVar126._8_4_ = ABS(local_1f8);
    auVar126._12_4_ = ABS(fStack_33c);
    auVar92._0_8_ = CONCAT44(fVar109,fVar107) & 0x7fffffff7fffffff;
    auVar92._8_4_ = ABS(local_3a8);
    auVar92._12_4_ = ABS(fVar108);
    auVar60 = maxps(auVar126,auVar92);
    auVar60 = maxps(auVar190,auVar60);
    fStack_234 = auVar60._4_4_;
    fVar96 = fStack_234;
    if (fStack_234 <= auVar60._0_4_) {
      fVar96 = auVar60._0_4_;
    }
    auVar177._8_8_ = auVar60._8_8_;
    auVar177._0_8_ = auVar60._8_8_;
    if (auVar60._8_4_ <= fVar96) {
      auVar177._0_4_ = fVar96;
    }
    local_238 = (float)iVar7;
    fStack_230 = fStack_234;
    fStack_22c = fStack_234;
    lVar39 = (long)iVar7 * 0x44;
    fVar96 = *(float *)(catmullrom_basis0 + lVar39 + 0x908);
    fVar98 = *(float *)(catmullrom_basis0 + lVar39 + 0x90c);
    fVar101 = *(float *)(catmullrom_basis0 + lVar39 + 0x910);
    fVar118 = *(float *)(catmullrom_basis0 + lVar39 + 0x914);
    fStack_3d4 = local_3d8;
    fStack_3d0 = local_3d8;
    fStack_3cc = local_3d8;
    fStack_3c4 = local_3c8;
    fStack_3c0 = local_3c8;
    fStack_3bc = local_3c8;
    fVar120 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar39 + 0xd8c);
    fVar123 = *(float *)(catmullrom_basis0 + lVar39 + 0xd90);
    fVar135 = *(float *)(catmullrom_basis0 + lVar39 + 0xd94);
    auVar13 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar39 + 0xd8c);
    fVar136 = *(float *)(catmullrom_basis0 + lVar39 + 0xd98);
    local_348 = *pfVar3;
    fStack_344 = pfVar3[1];
    local_358 = *pfVar4;
    fStack_354 = pfVar4[1];
    fStack_34c = fVar108;
    fVar173 = *(float *)(catmullrom_basis0 + lVar39 + 0x484);
    fVar161 = *(float *)(catmullrom_basis0 + lVar39 + 0x488);
    fVar168 = *(float *)(catmullrom_basis0 + lVar39 + 0x48c);
    fVar170 = *(float *)(catmullrom_basis0 + lVar39 + 0x490);
    local_228 = *pfVar2;
    fStack_224 = pfVar2[1];
    fVar179 = *(float *)(catmullrom_basis0 + lVar39);
    fVar159 = *(float *)(catmullrom_basis0 + lVar39 + 4);
    fVar160 = *(float *)(catmullrom_basis0 + lVar39 + 8);
    fVar182 = *(float *)(catmullrom_basis0 + lVar39 + 0xc);
    local_1c8 = local_218 * fVar179 + fVar137 * fVar173 + local_3d8 * fVar96 + fVar107 * fVar120;
    fStack_1c4 = local_218 * fVar159 + fVar137 * fVar161 + local_3d8 * fVar98 + fVar107 * fVar123;
    fStack_1c0 = local_218 * fVar160 + fVar137 * fVar168 + local_3d8 * fVar101 + fVar107 * fVar135;
    fStack_1bc = local_218 * fVar182 + fVar137 * fVar170 + local_3d8 * fVar118 + fVar107 * fVar136;
    local_328 = local_1a8 * fVar179 + local_198 * fVar173 + local_3c8 * fVar96 + fVar109 * fVar120;
    fStack_324 = local_1a8 * fVar159 + local_198 * fVar161 + local_3c8 * fVar98 + fVar109 * fVar123;
    fStack_320 = local_1a8 * fVar160 + local_198 * fVar168 + local_3c8 * fVar101 + fVar109 * fVar135
    ;
    fStack_31c = local_1a8 * fVar182 + local_198 * fVar170 + local_3c8 * fVar118 + fVar109 * fVar136
    ;
    fVar218 = fStack_36c * fVar179 + fStack_21c * fVar173 + fStack_33c * fVar96 + fVar108 * fVar120;
    fVar220 = fStack_36c * fVar159 + fStack_21c * fVar161 + fStack_33c * fVar98 + fVar108 * fVar123;
    local_3f8._0_8_ = CONCAT44(fVar220,fVar218);
    local_3f8._8_4_ =
         fStack_36c * fVar160 + fStack_21c * fVar168 + fStack_33c * fVar101 + fVar108 * fVar135;
    local_3f8._12_4_ =
         fStack_36c * fVar182 + fStack_21c * fVar170 + fStack_33c * fVar118 + fVar108 * fVar136;
    fVar120 = *(float *)(catmullrom_basis1 + lVar39 + 0xd8c);
    fVar123 = *(float *)(catmullrom_basis1 + lVar39 + 0xd90);
    fVar135 = *(float *)(catmullrom_basis1 + lVar39 + 0xd94);
    fVar187 = *(float *)(catmullrom_basis1 + lVar39 + 0xd98);
    fVar193 = *(float *)(catmullrom_basis1 + lVar39 + 0x908);
    fVar194 = *(float *)(catmullrom_basis1 + lVar39 + 0x90c);
    fVar195 = *(float *)(catmullrom_basis1 + lVar39 + 0x910);
    fVar197 = *(float *)(catmullrom_basis1 + lVar39 + 0x914);
    local_168 = fStack_33c;
    fStack_164 = fStack_33c;
    fStack_160 = fStack_33c;
    fStack_15c = fStack_33c;
    fVar198 = *(float *)(catmullrom_basis1 + lVar39 + 0x484);
    fVar199 = *(float *)(catmullrom_basis1 + lVar39 + 0x488);
    fVar200 = *(float *)(catmullrom_basis1 + lVar39 + 0x48c);
    fVar201 = *(float *)(catmullrom_basis1 + lVar39 + 0x490);
    fStack_194 = local_198;
    fStack_190 = local_198;
    fStack_18c = local_198;
    local_178 = fStack_21c;
    fStack_174 = fStack_21c;
    fStack_170 = fStack_21c;
    fStack_16c = fStack_21c;
    fVar202 = *(float *)(catmullrom_basis1 + lVar39);
    fVar206 = *(float *)(catmullrom_basis1 + lVar39 + 4);
    fVar208 = *(float *)(catmullrom_basis1 + lVar39 + 8);
    fVar210 = *(float *)(catmullrom_basis1 + lVar39 + 0xc);
    fStack_214 = local_218;
    fStack_210 = local_218;
    fStack_20c = local_218;
    local_1b8 = local_218 * fVar202 + fVar137 * fVar198 + local_3d8 * fVar193 + fVar107 * fVar120;
    fStack_1b4 = local_218 * fVar206 + fVar137 * fVar199 + local_3d8 * fVar194 + fVar107 * fVar123;
    fStack_1b0 = local_218 * fVar208 + fVar137 * fVar200 + local_3d8 * fVar195 + fVar107 * fVar135;
    fStack_1ac = local_218 * fVar210 + fVar137 * fVar201 + local_3d8 * fVar197 + fVar107 * fVar187;
    fStack_1a4 = local_1a8;
    fStack_1a0 = local_1a8;
    fStack_19c = local_1a8;
    fVar227 = local_1a8 * fVar202 + local_198 * fVar198 + local_3c8 * fVar193 + fVar109 * fVar120;
    fVar169 = local_1a8 * fVar206 + local_198 * fVar199 + local_3c8 * fVar194 + fVar109 * fVar123;
    fVar171 = local_1a8 * fVar208 + local_198 * fVar200 + local_3c8 * fVar195 + fVar109 * fVar135;
    fVar172 = local_1a8 * fVar210 + local_198 * fVar201 + local_3c8 * fVar197 + fVar109 * fVar187;
    local_188 = fStack_36c;
    fStack_184 = fStack_36c;
    fStack_180 = fStack_36c;
    fStack_17c = fStack_36c;
    auVar214._0_4_ =
         fStack_36c * fVar202 + fStack_21c * fVar198 + fStack_33c * fVar193 + fVar108 * fVar120;
    auVar214._4_4_ =
         fStack_36c * fVar206 + fStack_21c * fVar199 + fStack_33c * fVar194 + fVar108 * fVar123;
    auVar214._8_4_ =
         fStack_36c * fVar208 + fStack_21c * fVar200 + fStack_33c * fVar195 + fVar108 * fVar135;
    auVar214._12_4_ =
         fStack_36c * fVar210 + fStack_21c * fVar201 + fStack_33c * fVar197 + fVar108 * fVar187;
    fVar174 = local_1b8 - local_1c8;
    fVar180 = fStack_1b4 - fStack_1c4;
    fVar183 = fStack_1b0 - fStack_1c0;
    fVar185 = fStack_1ac - fStack_1bc;
    fVar212 = fVar227 - local_328;
    fVar219 = fVar169 - fStack_324;
    fVar221 = fVar171 - fStack_320;
    fVar226 = fVar172 - fStack_31c;
    fVar230 = local_328 * fVar174 - local_1c8 * fVar212;
    fVar232 = fStack_324 * fVar180 - fStack_1c4 * fVar219;
    fVar235 = fStack_320 * fVar183 - fStack_1c0 * fVar221;
    fVar238 = fStack_31c * fVar185 - fStack_1bc * fVar226;
    auVar191._8_4_ = local_3f8._8_4_;
    auVar191._0_8_ = local_3f8._0_8_;
    auVar191._12_4_ = local_3f8._12_4_;
    auVar60 = maxps(auVar191,auVar214);
    bVar29 = fVar230 * fVar230 <=
             auVar60._0_4_ * auVar60._0_4_ * (fVar174 * fVar174 + fVar212 * fVar212) &&
             0.0 < local_238;
    bVar30 = fVar232 * fVar232 <=
             auVar60._4_4_ * auVar60._4_4_ * (fVar180 * fVar180 + fVar219 * fVar219) &&
             1.0 < local_238;
    bVar28 = fVar235 * fVar235 <=
             auVar60._8_4_ * auVar60._8_4_ * (fVar183 * fVar183 + fVar221 * fVar221) &&
             2.0 < local_238;
    bVar36 = fVar238 * fVar238 <=
             auVar60._12_4_ * auVar60._12_4_ * (fVar185 * fVar185 + fVar226 * fVar226) &&
             3.0 < local_238;
    local_2e8 = auVar177._0_4_;
    fStack_2e4 = auVar177._4_4_;
    fStack_2e0 = auVar177._8_4_;
    fStack_2dc = auVar177._12_4_;
    local_2e8 = local_2e8 * 4.7683716e-07;
    auVar9._4_4_ = -(uint)bVar30;
    auVar9._0_4_ = -(uint)bVar29;
    auVar9._8_4_ = -(uint)bVar28;
    auVar9._12_4_ = -(uint)bVar36;
    uVar43 = movmskps((int)local_300,auVar9);
    p_Var33 = (RTCFilterFunctionN)(ulong)uVar43;
    fStack_204 = local_208;
    fStack_200 = local_208;
    fStack_1fc = local_208;
    fStack_394 = local_398;
    fStack_390 = local_398;
    fStack_38c = local_398;
    fStack_314 = local_318;
    fStack_310 = local_318;
    fStack_30c = local_318;
    fStack_1f4 = local_1f8;
    fStack_1f0 = local_1f8;
    fStack_1ec = local_1f8;
    fStack_3a4 = local_3a8;
    fStack_3a0 = local_3a8;
    fStack_39c = local_3a8;
    if (uVar43 == 0) {
      bVar36 = false;
    }
    else {
      fVar238 = fVar120 * local_3a8 + fVar193 * local_1f8 + fVar198 * local_318 +
                fVar202 * local_398;
      fVar83 = fVar123 * local_3a8 + fVar194 * local_1f8 + fVar199 * local_318 + fVar206 * local_398
      ;
      fVar85 = fVar135 * local_3a8 + fVar195 * local_1f8 + fVar200 * local_318 + fVar208 * local_398
      ;
      fVar86 = fVar187 * local_3a8 + fVar197 * local_1f8 + fVar201 * local_318 + fVar210 * local_398
      ;
      local_388._0_4_ = auVar13._0_4_;
      local_388._4_4_ = auVar13._4_4_;
      fStack_380 = auVar13._8_4_;
      fVar110 = (float)local_388._0_4_ * local_3a8 + fVar96 * local_1f8 + fVar173 * local_318 +
                fVar179 * local_398;
      fVar119 = (float)local_388._4_4_ * local_3a8 + fVar98 * local_1f8 + fVar161 * local_318 +
                fVar159 * local_398;
      fVar121 = fStack_380 * local_3a8 + fVar101 * local_1f8 + fVar168 * local_318 +
                fVar160 * local_398;
      fVar122 = fVar136 * local_3a8 + fVar118 * local_1f8 + fVar170 * local_318 +
                fVar182 * local_398;
      fVar96 = *(float *)(catmullrom_basis0 + lVar39 + 0x1210);
      fVar98 = *(float *)(catmullrom_basis0 + lVar39 + 0x1214);
      fVar101 = *(float *)(catmullrom_basis0 + lVar39 + 0x1218);
      fVar118 = *(float *)(catmullrom_basis0 + lVar39 + 0x121c);
      fVar120 = *(float *)(catmullrom_basis0 + lVar39 + 0x1694);
      fVar123 = *(float *)(catmullrom_basis0 + lVar39 + 0x1698);
      fVar135 = *(float *)(catmullrom_basis0 + lVar39 + 0x169c);
      fVar136 = *(float *)(catmullrom_basis0 + lVar39 + 0x16a0);
      fVar173 = *(float *)(catmullrom_basis0 + lVar39 + 0x1b18);
      fVar161 = *(float *)(catmullrom_basis0 + lVar39 + 0x1b1c);
      fVar168 = *(float *)(catmullrom_basis0 + lVar39 + 0x1b20);
      fVar170 = *(float *)(catmullrom_basis0 + lVar39 + 0x1b24);
      fVar179 = *(float *)(catmullrom_basis0 + lVar39 + 0x1f9c);
      fVar159 = *(float *)(catmullrom_basis0 + lVar39 + 0x1fa0);
      fVar160 = *(float *)(catmullrom_basis0 + lVar39 + 0x1fa4);
      fVar182 = *(float *)(catmullrom_basis0 + lVar39 + 0x1fa8);
      _local_388 = auVar214;
      fVar203 = local_218 * fVar96 + fVar137 * fVar120 + local_3d8 * fVar173 + fVar107 * fVar179;
      fVar207 = local_218 * fVar98 + fVar137 * fVar123 + local_3d8 * fVar161 + fVar107 * fVar159;
      fVar209 = local_218 * fVar101 + fVar137 * fVar135 + local_3d8 * fVar168 + fVar107 * fVar160;
      fVar211 = local_218 * fVar118 + fVar137 * fVar136 + local_3d8 * fVar170 + fVar107 * fVar182;
      fVar231 = local_1a8 * fVar96 + local_198 * fVar120 + local_3c8 * fVar173 + fVar109 * fVar179;
      fVar233 = local_1a8 * fVar98 + local_198 * fVar123 + local_3c8 * fVar161 + fVar109 * fVar159;
      fVar236 = local_1a8 * fVar101 + local_198 * fVar135 + local_3c8 * fVar168 + fVar109 * fVar160;
      fVar239 = local_1a8 * fVar118 + local_198 * fVar136 + local_3c8 * fVar170 + fVar109 * fVar182;
      fVar187 = *(float *)(catmullrom_basis1 + lVar39 + 0x1210);
      fVar193 = *(float *)(catmullrom_basis1 + lVar39 + 0x1214);
      fVar194 = *(float *)(catmullrom_basis1 + lVar39 + 0x1218);
      fVar195 = *(float *)(catmullrom_basis1 + lVar39 + 0x121c);
      fVar197 = *(float *)(catmullrom_basis1 + lVar39 + 0x1b18);
      fVar198 = *(float *)(catmullrom_basis1 + lVar39 + 0x1b1c);
      fVar199 = *(float *)(catmullrom_basis1 + lVar39 + 0x1b20);
      fVar200 = *(float *)(catmullrom_basis1 + lVar39 + 0x1b24);
      fVar201 = *(float *)(catmullrom_basis1 + lVar39 + 0x1f9c);
      fVar202 = *(float *)(catmullrom_basis1 + lVar39 + 0x1fa0);
      fVar206 = *(float *)(catmullrom_basis1 + lVar39 + 0x1fa4);
      fVar208 = *(float *)(catmullrom_basis1 + lVar39 + 0x1fa8);
      fVar210 = *(float *)(catmullrom_basis1 + lVar39 + 0x1694);
      fVar230 = *(float *)(catmullrom_basis1 + lVar39 + 0x1698);
      fVar232 = *(float *)(catmullrom_basis1 + lVar39 + 0x169c);
      fVar235 = *(float *)(catmullrom_basis1 + lVar39 + 0x16a0);
      fVar175 = local_218 * fVar187 + fVar137 * fVar210 + local_3d8 * fVar197 + fVar107 * fVar201;
      fVar181 = local_218 * fVar193 + fVar137 * fVar230 + local_3d8 * fVar198 + fVar107 * fVar202;
      fVar184 = local_218 * fVar194 + fVar137 * fVar232 + local_3d8 * fVar199 + fVar107 * fVar206;
      fVar186 = local_218 * fVar195 + fVar137 * fVar235 + local_3d8 * fVar200 + fVar107 * fVar208;
      fVar88 = local_1a8 * fVar187 + local_198 * fVar210 + local_3c8 * fVar197 + fVar109 * fVar201;
      fVar97 = local_1a8 * fVar193 + local_198 * fVar230 + local_3c8 * fVar198 + fVar109 * fVar202;
      fVar99 = local_1a8 * fVar194 + local_198 * fVar232 + local_3c8 * fVar199 + fVar109 * fVar206;
      fVar100 = local_1a8 * fVar195 + local_198 * fVar235 + local_3c8 * fVar200 + fVar109 * fVar208;
      auVar215._0_8_ = CONCAT44(fVar207,fVar203) & 0x7fffffff7fffffff;
      auVar215._8_4_ = ABS(fVar209);
      auVar215._12_4_ = ABS(fVar211);
      auVar192._0_8_ = CONCAT44(fVar233,fVar231) & 0x7fffffff7fffffff;
      auVar192._8_4_ = ABS(fVar236);
      auVar192._12_4_ = ABS(fVar239);
      auVar60 = maxps(auVar215,auVar192);
      auVar222._0_8_ =
           CONCAT44(fVar98 * local_398 +
                    fVar123 * local_318 + fVar161 * local_1f8 + fVar159 * local_3a8,
                    fVar96 * local_398 +
                    fVar120 * local_318 + fVar173 * local_1f8 + fVar179 * local_3a8) &
           0x7fffffff7fffffff;
      auVar222._8_4_ =
           ABS(fVar101 * local_398 + fVar135 * local_318 + fVar168 * local_1f8 + fVar160 * local_3a8
              );
      auVar222._12_4_ =
           ABS(fVar118 * local_398 + fVar136 * local_318 + fVar170 * local_1f8 + fVar182 * local_3a8
              );
      auVar60 = maxps(auVar60,auVar222);
      uVar44 = -(uint)(local_2e8 <= auVar60._0_4_);
      uVar45 = -(uint)(local_2e8 <= auVar60._4_4_);
      uVar46 = -(uint)(local_2e8 <= auVar60._8_4_);
      uVar47 = -(uint)(local_2e8 <= auVar60._12_4_);
      fVar123 = (float)((uint)fVar203 & uVar44 | ~uVar44 & (uint)fVar174);
      fVar136 = (float)((uint)fVar207 & uVar45 | ~uVar45 & (uint)fVar180);
      fVar168 = (float)((uint)fVar209 & uVar46 | ~uVar46 & (uint)fVar183);
      fVar179 = (float)((uint)fVar211 & uVar47 | ~uVar47 & (uint)fVar185);
      auVar11._4_4_ = fVar219;
      auVar11._0_4_ = fVar212;
      auVar11._8_4_ = fVar221;
      auVar11._12_4_ = fVar226;
      fVar160 = (float)(~uVar44 & (uint)fVar212 | (uint)fVar231 & uVar44);
      fVar182 = (float)(~uVar45 & (uint)fVar219 | (uint)fVar233 & uVar45);
      fVar203 = (float)(~uVar46 & (uint)fVar221 | (uint)fVar236 & uVar46);
      fVar207 = (float)(~uVar47 & (uint)fVar226 | (uint)fVar239 & uVar47);
      auVar223._0_8_ = CONCAT44(fVar181,fVar175) & 0x7fffffff7fffffff;
      auVar223._8_4_ = ABS(fVar184);
      auVar223._12_4_ = ABS(fVar186);
      auVar196._0_8_ = CONCAT44(fVar97,fVar88) & 0x7fffffff7fffffff;
      auVar196._8_4_ = ABS(fVar99);
      auVar196._12_4_ = ABS(fVar100);
      auVar60 = maxps(auVar223,auVar196);
      auVar165._0_8_ =
           CONCAT44(fVar193 * local_398 +
                    fVar230 * local_318 + fVar198 * local_1f8 + fVar202 * local_3a8,
                    fVar187 * local_398 +
                    fVar210 * local_318 + fVar197 * local_1f8 + fVar201 * local_3a8) &
           0x7fffffff7fffffff;
      auVar165._8_4_ =
           ABS(fVar194 * local_398 + fVar232 * local_318 + fVar199 * local_1f8 + fVar206 * local_3a8
              );
      auVar165._12_4_ =
           ABS(fVar195 * local_398 + fVar235 * local_318 + fVar200 * local_1f8 + fVar208 * local_3a8
              );
      auVar60 = maxps(auVar60,auVar165);
      uVar44 = -(uint)(local_2e8 <= auVar60._0_4_);
      uVar45 = -(uint)(local_2e8 <= auVar60._4_4_);
      uVar46 = -(uint)(local_2e8 <= auVar60._8_4_);
      uVar47 = -(uint)(local_2e8 <= auVar60._12_4_);
      fVar120 = (float)((uint)fVar175 & uVar44 | ~uVar44 & (uint)fVar174);
      fVar135 = (float)((uint)fVar181 & uVar45 | ~uVar45 & (uint)fVar180);
      fVar173 = (float)((uint)fVar184 & uVar46 | ~uVar46 & (uint)fVar183);
      fVar161 = (float)((uint)fVar186 & uVar47 | ~uVar47 & (uint)fVar185);
      fVar187 = (float)(~uVar44 & (uint)fVar212 | (uint)fVar88 & uVar44);
      fVar193 = (float)(~uVar45 & (uint)fVar219 | (uint)fVar97 & uVar45);
      fVar199 = (float)(~uVar46 & (uint)fVar221 | (uint)fVar99 & uVar46);
      fVar200 = (float)(~uVar47 & (uint)fVar226 | (uint)fVar100 & uVar47);
      auVar93._0_4_ = fVar160 * fVar160 + fVar123 * fVar123;
      auVar93._4_4_ = fVar182 * fVar182 + fVar136 * fVar136;
      auVar93._8_4_ = fVar203 * fVar203 + fVar168 * fVar168;
      auVar93._12_4_ = fVar207 * fVar207 + fVar179 * fVar179;
      auVar60 = rsqrtps(auVar11,auVar93);
      fVar96 = auVar60._0_4_;
      fVar98 = auVar60._4_4_;
      fVar101 = auVar60._8_4_;
      fVar118 = auVar60._12_4_;
      auVar127._0_4_ = fVar96 * fVar96 * auVar93._0_4_ * 0.5 * fVar96;
      auVar127._4_4_ = fVar98 * fVar98 * auVar93._4_4_ * 0.5 * fVar98;
      auVar127._8_4_ = fVar101 * fVar101 * auVar93._8_4_ * 0.5 * fVar101;
      auVar127._12_4_ = fVar118 * fVar118 * auVar93._12_4_ * 0.5 * fVar118;
      fVar201 = fVar96 * 1.5 - auVar127._0_4_;
      fVar202 = fVar98 * 1.5 - auVar127._4_4_;
      fVar206 = fVar101 * 1.5 - auVar127._8_4_;
      fVar208 = fVar118 * 1.5 - auVar127._12_4_;
      auVar94._0_4_ = fVar187 * fVar187 + fVar120 * fVar120;
      auVar94._4_4_ = fVar193 * fVar193 + fVar135 * fVar135;
      auVar94._8_4_ = fVar199 * fVar199 + fVar173 * fVar173;
      auVar94._12_4_ = fVar200 * fVar200 + fVar161 * fVar161;
      auVar60 = rsqrtps(auVar127,auVar94);
      fVar96 = auVar60._0_4_;
      fVar98 = auVar60._4_4_;
      fVar101 = auVar60._8_4_;
      fVar118 = auVar60._12_4_;
      fVar96 = fVar96 * 1.5 - fVar96 * fVar96 * auVar94._0_4_ * 0.5 * fVar96;
      fVar170 = fVar98 * 1.5 - fVar98 * fVar98 * auVar94._4_4_ * 0.5 * fVar98;
      fVar101 = fVar101 * 1.5 - fVar101 * fVar101 * auVar94._8_4_ * 0.5 * fVar101;
      fVar159 = fVar118 * 1.5 - fVar118 * fVar118 * auVar94._12_4_ * 0.5 * fVar118;
      fVar194 = fVar160 * fVar201 * fVar218;
      fVar195 = fVar182 * fVar202 * fVar220;
      fVar197 = fVar203 * fVar206 * local_3f8._8_4_;
      fVar198 = fVar207 * fVar208 * local_3f8._12_4_;
      fVar98 = -fVar123 * fVar201 * fVar218;
      fVar118 = -fVar136 * fVar202 * fVar220;
      fVar123 = -fVar168 * fVar206 * local_3f8._8_4_;
      fVar136 = -fVar179 * fVar208 * local_3f8._12_4_;
      fVar99 = fVar201 * 0.0 * fVar218;
      fVar100 = fVar202 * 0.0 * fVar220;
      fVar175 = fVar206 * 0.0 * local_3f8._8_4_;
      fVar181 = fVar208 * 0.0 * local_3f8._12_4_;
      local_338 = fVar110 + fVar99;
      fStack_334 = fVar119 + fVar100;
      fStack_330 = fVar121 + fVar175;
      fStack_32c = fVar122 + fVar181;
      fVar206 = fVar187 * fVar96 * auVar214._0_4_;
      fVar208 = fVar193 * fVar170 * auVar214._4_4_;
      fVar210 = fVar199 * fVar101 * auVar214._8_4_;
      fVar212 = fVar200 * fVar159 * auVar214._12_4_;
      fVar219 = local_1b8 + fVar206;
      fVar221 = fStack_1b4 + fVar208;
      fVar226 = fStack_1b0 + fVar210;
      fVar174 = fStack_1ac + fVar212;
      fVar160 = -fVar120 * fVar96 * auVar214._0_4_;
      fVar182 = -fVar135 * fVar170 * auVar214._4_4_;
      fVar187 = -fVar173 * fVar101 * auVar214._8_4_;
      fVar193 = -fVar161 * fVar159 * auVar214._12_4_;
      fVar180 = fVar227 + fVar160;
      fVar183 = fVar169 + fVar182;
      fVar185 = fVar171 + fVar187;
      fVar230 = fVar172 + fVar193;
      fVar168 = fVar96 * 0.0 * auVar214._0_4_;
      fVar170 = fVar170 * 0.0 * auVar214._4_4_;
      fVar179 = fVar101 * 0.0 * auVar214._8_4_;
      fVar159 = fVar159 * 0.0 * auVar214._12_4_;
      fVar199 = local_1c8 - fVar194;
      fVar200 = fStack_1c4 - fVar195;
      fVar201 = fStack_1c0 - fVar197;
      fVar202 = fStack_1bc - fVar198;
      fVar232 = fVar238 + fVar168;
      fVar235 = fVar83 + fVar170;
      fVar88 = fVar85 + fVar179;
      fVar97 = fVar86 + fVar159;
      fVar96 = local_328 - fVar98;
      fVar101 = fStack_324 - fVar118;
      fVar120 = fStack_320 - fVar123;
      fVar135 = fStack_31c - fVar136;
      fVar110 = fVar110 - fVar99;
      fVar119 = fVar119 - fVar100;
      fVar121 = fVar121 - fVar175;
      fVar122 = fVar122 - fVar181;
      uVar44 = -(uint)(0.0 < (fVar96 * (fVar232 - fVar110) - fVar110 * (fVar180 - fVar96)) * 0.0 +
                             (fVar110 * (fVar219 - fVar199) - (fVar232 - fVar110) * fVar199) * 0.0 +
                             ((fVar180 - fVar96) * fVar199 - (fVar219 - fVar199) * fVar96));
      uVar45 = -(uint)(0.0 < (fVar101 * (fVar235 - fVar119) - fVar119 * (fVar183 - fVar101)) * 0.0 +
                             (fVar119 * (fVar221 - fVar200) - (fVar235 - fVar119) * fVar200) * 0.0 +
                             ((fVar183 - fVar101) * fVar200 - (fVar221 - fVar200) * fVar101));
      uVar46 = -(uint)(0.0 < (fVar120 * (fVar88 - fVar121) - fVar121 * (fVar185 - fVar120)) * 0.0 +
                             (fVar121 * (fVar226 - fVar201) - (fVar88 - fVar121) * fVar201) * 0.0 +
                             ((fVar185 - fVar120) * fVar201 - (fVar226 - fVar201) * fVar120));
      uVar47 = -(uint)(0.0 < (fVar135 * (fVar97 - fVar122) - fVar122 * (fVar230 - fVar135)) * 0.0 +
                             (fVar122 * (fVar174 - fVar202) - (fVar97 - fVar122) * fVar202) * 0.0 +
                             ((fVar230 - fVar135) * fVar202 - (fVar174 - fVar202) * fVar135));
      fVar194 = (float)((uint)(local_1b8 - fVar206) & uVar44 | ~uVar44 & (uint)(local_1c8 + fVar194)
                       );
      fVar195 = (float)((uint)(fStack_1b4 - fVar208) & uVar45 |
                       ~uVar45 & (uint)(fStack_1c4 + fVar195));
      fVar197 = (float)((uint)(fStack_1b0 - fVar210) & uVar46 |
                       ~uVar46 & (uint)(fStack_1c0 + fVar197));
      fVar198 = (float)((uint)(fStack_1ac - fVar212) & uVar47 |
                       ~uVar47 & (uint)(fStack_1bc + fVar198));
      fVar173 = (float)((uint)(fVar227 - fVar160) & uVar44 | ~uVar44 & (uint)(local_328 + fVar98));
      fVar161 = (float)((uint)(fVar169 - fVar182) & uVar45 | ~uVar45 & (uint)(fStack_324 + fVar118))
      ;
      fStack_3e0 = (float)((uint)(fVar171 - fVar187) & uVar46 |
                          ~uVar46 & (uint)(fStack_320 + fVar123));
      fStack_3dc = (float)((uint)(fVar172 - fVar193) & uVar47 |
                          ~uVar47 & (uint)(fStack_31c + fVar136));
      fVar160 = (float)((uint)(fVar238 - fVar168) & uVar44 | ~uVar44 & (uint)local_338);
      fVar182 = (float)((uint)(fVar83 - fVar170) & uVar45 | ~uVar45 & (uint)fStack_334);
      fVar187 = (float)((uint)(fVar85 - fVar179) & uVar46 | ~uVar46 & (uint)fStack_330);
      fVar193 = (float)((uint)(fVar86 - fVar159) & uVar47 | ~uVar47 & (uint)fStack_32c);
      fVar206 = (float)((uint)fVar199 & uVar44 | ~uVar44 & (uint)fVar219);
      fVar208 = (float)((uint)fVar200 & uVar45 | ~uVar45 & (uint)fVar221);
      fVar210 = (float)((uint)fVar201 & uVar46 | ~uVar46 & (uint)fVar226);
      fVar212 = (float)((uint)fVar202 & uVar47 | ~uVar47 & (uint)fVar174);
      fVar98 = (float)((uint)fVar96 & uVar44 | ~uVar44 & (uint)fVar180);
      fVar118 = (float)((uint)fVar101 & uVar45 | ~uVar45 & (uint)fVar183);
      fVar123 = (float)((uint)fVar120 & uVar46 | ~uVar46 & (uint)fVar185);
      fVar136 = (float)((uint)fVar135 & uVar47 | ~uVar47 & (uint)fVar230);
      fVar168 = (float)((uint)fVar110 & uVar44 | ~uVar44 & (uint)fVar232);
      fVar170 = (float)((uint)fVar119 & uVar45 | ~uVar45 & (uint)fVar235);
      fVar179 = (float)((uint)fVar121 & uVar46 | ~uVar46 & (uint)fVar88);
      fVar159 = (float)((uint)fVar122 & uVar47 | ~uVar47 & (uint)fVar97);
      fVar219 = (float)((uint)fVar219 & uVar44 | ~uVar44 & (uint)fVar199) - fVar194;
      fVar221 = (float)((uint)fVar221 & uVar45 | ~uVar45 & (uint)fVar200) - fVar195;
      fVar226 = (float)((uint)fVar226 & uVar46 | ~uVar46 & (uint)fVar201) - fVar197;
      fVar227 = (float)((uint)fVar174 & uVar47 | ~uVar47 & (uint)fVar202) - fVar198;
      fVar169 = (float)((uint)fVar180 & uVar44 | ~uVar44 & (uint)fVar96) - fVar173;
      fVar171 = (float)((uint)fVar183 & uVar45 | ~uVar45 & (uint)fVar101) - fVar161;
      fVar172 = (float)((uint)fVar185 & uVar46 | ~uVar46 & (uint)fVar120) - fStack_3e0;
      fVar174 = (float)((uint)fVar230 & uVar47 | ~uVar47 & (uint)fVar135) - fStack_3dc;
      fVar180 = (float)((uint)fVar232 & uVar44 | ~uVar44 & (uint)fVar110) - fVar160;
      fVar183 = (float)((uint)fVar235 & uVar45 | ~uVar45 & (uint)fVar119) - fVar182;
      fVar185 = (float)((uint)fVar88 & uVar46 | ~uVar46 & (uint)fVar121) - fVar187;
      fVar230 = (float)((uint)fVar97 & uVar47 | ~uVar47 & (uint)fVar122) - fVar193;
      fVar85 = fVar194 - fVar206;
      fVar86 = fVar195 - fVar208;
      fVar88 = fVar197 - fVar210;
      fVar97 = fVar198 - fVar212;
      fVar199 = fVar173 - fVar98;
      fVar200 = fVar161 - fVar118;
      fVar201 = fStack_3e0 - fVar123;
      fVar202 = fStack_3dc - fVar136;
      local_3e8 = CONCAT44(fVar161,fVar173);
      fVar96 = fVar160 - fVar168;
      fVar101 = fVar182 - fVar170;
      fVar120 = fVar187 - fVar179;
      fVar135 = fVar193 - fVar159;
      fVar232 = (fVar173 * fVar180 - fVar160 * fVar169) * 0.0 +
                (fVar160 * fVar219 - fVar194 * fVar180) * 0.0 +
                (fVar194 * fVar169 - fVar173 * fVar219);
      fVar235 = (fVar161 * fVar183 - fVar182 * fVar171) * 0.0 +
                (fVar182 * fVar221 - fVar195 * fVar183) * 0.0 +
                (fVar195 * fVar171 - fVar161 * fVar221);
      auVar114._4_4_ = fVar235;
      auVar114._0_4_ = fVar232;
      fVar238 = (fStack_3e0 * fVar185 - fVar187 * fVar172) * 0.0 +
                (fVar187 * fVar226 - fVar197 * fVar185) * 0.0 +
                (fVar197 * fVar172 - fStack_3e0 * fVar226);
      fVar83 = (fStack_3dc * fVar230 - fVar193 * fVar174) * 0.0 +
               (fVar193 * fVar227 - fVar198 * fVar230) * 0.0 +
               (fVar198 * fVar174 - fStack_3dc * fVar227);
      auVar228._0_4_ =
           (fVar98 * fVar96 - fVar168 * fVar199) * 0.0 +
           (fVar168 * fVar85 - fVar206 * fVar96) * 0.0 + (fVar206 * fVar199 - fVar98 * fVar85);
      auVar228._4_4_ =
           (fVar118 * fVar101 - fVar170 * fVar200) * 0.0 +
           (fVar170 * fVar86 - fVar208 * fVar101) * 0.0 + (fVar208 * fVar200 - fVar118 * fVar86);
      auVar228._8_4_ =
           (fVar123 * fVar120 - fVar179 * fVar201) * 0.0 +
           (fVar179 * fVar88 - fVar210 * fVar120) * 0.0 + (fVar210 * fVar201 - fVar123 * fVar88);
      auVar228._12_4_ =
           (fVar136 * fVar135 - fVar159 * fVar202) * 0.0 +
           (fVar159 * fVar97 - fVar212 * fVar135) * 0.0 + (fVar212 * fVar202 - fVar136 * fVar97);
      auVar114._8_4_ = fVar238;
      auVar114._12_4_ = fVar83;
      auVar60 = maxps(auVar114,auVar228);
      bVar29 = auVar60._0_4_ <= 0.0 && bVar29;
      auVar115._0_4_ = -(uint)bVar29;
      bVar30 = auVar60._4_4_ <= 0.0 && bVar30;
      auVar115._4_4_ = -(uint)bVar30;
      bVar28 = auVar60._8_4_ <= 0.0 && bVar28;
      auVar115._8_4_ = -(uint)bVar28;
      bVar36 = auVar60._12_4_ <= 0.0 && bVar36;
      auVar115._12_4_ = -(uint)bVar36;
      iVar32 = movmskps(uVar43,auVar115);
      if (iVar32 == 0) {
LAB_00303e9e:
        auVar78._8_8_ = uStack_2f0;
        auVar78._0_8_ = local_2f8;
      }
      else {
        fVar98 = local_3b0->tfar;
        fVar170 = fVar199 * fVar180 - fVar96 * fVar169;
        fVar179 = fVar200 * fVar183 - fVar101 * fVar171;
        fVar159 = fVar201 * fVar185 - fVar120 * fVar172;
        fVar206 = fVar202 * fVar230 - fVar135 * fVar174;
        fVar96 = fVar96 * fVar219 - fVar180 * fVar85;
        fVar118 = fVar101 * fVar221 - fVar183 * fVar86;
        fVar123 = fVar120 * fVar226 - fVar185 * fVar88;
        fVar136 = fVar135 * fVar227 - fVar230 * fVar97;
        fVar199 = fVar85 * fVar169 - fVar199 * fVar219;
        fVar200 = fVar86 * fVar171 - fVar200 * fVar221;
        fVar201 = fVar88 * fVar172 - fVar201 * fVar226;
        fVar202 = fVar97 * fVar174 - fVar202 * fVar227;
        auVar128._0_12_ = ZEXT812(0);
        auVar128._12_4_ = 0;
        auVar154._0_4_ = fVar170 * 0.0 + fVar96 * 0.0 + fVar199;
        auVar154._4_4_ = fVar179 * 0.0 + fVar118 * 0.0 + fVar200;
        auVar154._8_4_ = fVar159 * 0.0 + fVar123 * 0.0 + fVar201;
        auVar154._12_4_ = fVar206 * 0.0 + fVar136 * 0.0 + fVar202;
        auVar60 = rcpps(auVar128,auVar154);
        fVar101 = auVar60._0_4_;
        fVar120 = auVar60._4_4_;
        fVar135 = auVar60._8_4_;
        fVar168 = auVar60._12_4_;
        fVar101 = (1.0 - auVar154._0_4_ * fVar101) * fVar101 + fVar101;
        fVar120 = (1.0 - auVar154._4_4_ * fVar120) * fVar120 + fVar120;
        fVar135 = (1.0 - auVar154._8_4_ * fVar135) * fVar135 + fVar135;
        fVar168 = (1.0 - auVar154._12_4_ * fVar168) * fVar168 + fVar168;
        fVar96 = (fVar160 * fVar199 + fVar173 * fVar96 + fVar194 * fVar170) * fVar101;
        fVar118 = (fVar182 * fVar200 + fVar161 * fVar118 + fVar195 * fVar179) * fVar120;
        aVar178.v[1] = fVar118;
        aVar178.v[0] = fVar96;
        fVar123 = (fVar187 * fVar201 + fStack_3e0 * fVar123 + fVar197 * fVar159) * fVar135;
        fVar136 = (fVar193 * fVar202 + fStack_3dc * fVar136 + fVar198 * fVar206) * fVar168;
        bVar29 = (local_208 <= fVar96 && fVar96 <= fVar98) && bVar29;
        auVar129._0_4_ = -(uint)bVar29;
        bVar30 = (local_208 <= fVar118 && fVar118 <= fVar98) && bVar30;
        auVar129._4_4_ = -(uint)bVar30;
        bVar28 = (local_208 <= fVar123 && fVar123 <= fVar98) && bVar28;
        auVar129._8_4_ = -(uint)bVar28;
        bVar36 = (local_208 <= fVar136 && fVar136 <= fVar98) && bVar36;
        auVar129._12_4_ = -(uint)bVar36;
        iVar32 = movmskps(iVar32,auVar129);
        if (iVar32 == 0) goto LAB_00303e9e;
        auVar130._0_8_ =
             CONCAT44(-(uint)(auVar154._4_4_ != 0.0 && bVar30),
                      -(uint)(auVar154._0_4_ != 0.0 && bVar29));
        auVar130._8_4_ = -(uint)(auVar154._8_4_ != 0.0 && bVar28);
        auVar130._12_4_ = -(uint)(auVar154._12_4_ != 0.0 && bVar36);
        iVar32 = movmskps(iVar32,auVar130);
        auVar78._8_8_ = uStack_2f0;
        auVar78._0_8_ = local_2f8;
        if (iVar32 != 0) {
          fVar232 = fVar232 * fVar101;
          fVar235 = fVar235 * fVar120;
          fVar238 = fVar238 * fVar135;
          fVar83 = fVar83 * fVar168;
          auVar77._0_4_ = ~uVar44 & (uint)fVar232;
          auVar77._4_4_ = ~uVar45 & (uint)fVar235;
          auVar77._8_4_ = ~uVar46 & (uint)fVar238;
          auVar77._12_4_ = ~uVar47 & (uint)fVar83;
          auVar155._0_4_ = (uint)(1.0 - fVar232) & uVar44;
          auVar155._4_4_ = (uint)(1.0 - fVar235) & uVar45;
          auVar155._8_4_ = (uint)(1.0 - fVar238) & uVar46;
          auVar155._12_4_ = (uint)(1.0 - fVar83) & uVar47;
          local_428 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar155 | auVar77);
          auVar78._8_4_ = auVar130._8_4_;
          auVar78._0_8_ = auVar130._0_8_;
          auVar78._12_4_ = auVar130._12_4_;
          aVar178.v[2] = fVar123;
          aVar178.v[3] = fVar136;
          local_1d8 = (float)(~uVar44 & (uint)(auVar228._0_4_ * fVar101) |
                             (uint)(1.0 - auVar228._0_4_ * fVar101) & uVar44);
          fStack_1d4 = (float)(~uVar45 & (uint)(auVar228._4_4_ * fVar120) |
                              (uint)(1.0 - auVar228._4_4_ * fVar120) & uVar45);
          fStack_1d0 = (float)(~uVar46 & (uint)(auVar228._8_4_ * fVar135) |
                              (uint)(1.0 - auVar228._8_4_ * fVar135) & uVar46);
          fStack_1cc = (float)(~uVar47 & (uint)(auVar228._12_4_ * fVar168) |
                              (uint)(1.0 - auVar228._12_4_ * fVar168) & uVar47);
          local_438 = aVar178;
        }
      }
      uVar43 = movmskps(iVar32,auVar78);
      p_Var33 = (RTCFilterFunctionN)(ulong)uVar43;
      if (uVar43 == 0) {
        bVar36 = false;
      }
      else {
        fVar218 = (auVar214._0_4_ - fVar218) * local_428.v[0] + fVar218;
        fVar220 = (auVar214._4_4_ - fVar220) * local_428.v[1] + fVar220;
        fVar98 = (auVar214._8_4_ - local_3f8._8_4_) * local_428.v[2] + local_3f8._8_4_;
        fVar101 = (auVar214._12_4_ - local_3f8._12_4_) * local_428.v[3] + local_3f8._12_4_;
        fVar96 = local_300->depth_scale;
        bhit.valid.field_0._0_4_ =
             -(uint)(fVar96 * (fVar218 + fVar218) < local_438.v[0]) & auVar78._0_4_;
        bhit.valid.field_0._4_4_ =
             -(uint)(fVar96 * (fVar220 + fVar220) < local_438.v[1]) & auVar78._4_4_;
        bhit.valid.field_0._8_4_ =
             -(uint)(fVar96 * (fVar98 + fVar98) < local_438.v[2]) & auVar78._8_4_;
        bhit.valid.field_0._12_4_ =
             -(uint)(fVar96 * (fVar101 + fVar101) < local_438.v[3]) & auVar78._12_4_;
        uVar43 = movmskps((int)local_300,(undefined1  [16])bhit.valid.field_0);
        p_Var33 = (RTCFilterFunctionN)(ulong)uVar43;
        if (uVar43 != 0) {
          local_1d8 = local_1d8 + local_1d8 + -1.0;
          fStack_1d4 = fStack_1d4 + fStack_1d4 + -1.0;
          fStack_1d0 = fStack_1d0 + fStack_1d0 + -1.0;
          fStack_1cc = fStack_1cc + fStack_1cc + -1.0;
          bhit.U.field_0 = local_428;
          bhit.V.field_0.v[0] = local_1d8;
          bhit.V.field_0.v[1] = fStack_1d4;
          bhit.V.field_0.v[2] = fStack_1d0;
          bhit.V.field_0.v[3] = fStack_1cc;
          bhit.T.field_0 = local_438;
          bhit.i = 0;
          bhit.N = iVar7;
          bhit.curve3D.v0.field_0._0_8_ = *(undefined8 *)pfVar1;
          bhit.curve3D.v0.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
          bhit.curve3D.v1.field_0._0_8_ = *(undefined8 *)pfVar2;
          bhit.curve3D.v1.field_0._8_8_ = *(undefined8 *)(pfVar2 + 2);
          bhit.curve3D.v2.field_0._0_8_ = *(undefined8 *)pfVar3;
          bhit.curve3D.v2.field_0._8_8_ = *(undefined8 *)(pfVar3 + 2);
          bhit.curve3D.v3.field_0._0_8_ = *(undefined8 *)pfVar4;
          bhit.curve3D.v3.field_0._8_8_ = *(undefined8 *)(pfVar4 + 2);
          if ((pGVar8->mask & local_3b0->mask) != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar36 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar96 = 1.0 / local_238;
              bhit.vu.field_0.v[0] = fVar96 * (local_428.v[0] + 0.0);
              bhit.vu.field_0.v[1] = fVar96 * (local_428.v[1] + 1.0);
              bhit.vu.field_0.v[2] = fVar96 * (local_428.v[2] + 2.0);
              bhit.vu.field_0.v[3] = fVar96 * (local_428.v[3] + 3.0);
              bhit.vv.field_0._0_8_ = CONCAT44(fStack_1d4,local_1d8);
              bhit.vv.field_0._8_8_ = CONCAT44(fStack_1cc,fStack_1d0);
              bhit.vt.field_0 = local_438;
              uVar37 = (ulong)(byte)uVar43;
              local_3e8 = 0;
              if (uVar37 != 0) {
                for (; ((byte)uVar43 >> local_3e8 & 1) == 0; local_3e8 = local_3e8 + 1) {
                }
              }
              while (uVar37 != 0) {
                local_26c = bhit.vu.field_0.v[local_3e8];
                local_268 = bhit.vv.field_0.v[local_3e8];
                local_3f8._0_4_ = local_3b0->tfar;
                local_3b0->tfar = bhit.vt.field_0.v[local_3e8];
                fVar96 = 1.0 - local_26c;
                fVar101 = local_26c * 3.0;
                fVar118 = ((fVar101 + 2.0) * (fVar96 + fVar96) + fVar96 * -3.0 * fVar96) * 0.5;
                fVar98 = (fVar96 * -2.0 * local_26c + local_26c * local_26c) * 0.5;
                fVar101 = (local_26c * fVar101 + (fVar101 + -5.0) * (local_26c + local_26c)) * 0.5;
                fVar96 = (local_26c * (fVar96 + fVar96) - fVar96 * fVar96) * 0.5;
                args.context = context->user;
                local_278 = CONCAT44(fVar96 * fStack_374 +
                                     fVar101 * fStack_224 +
                                     fVar118 * fStack_344 + fVar98 * fStack_354,
                                     fVar96 * local_378 +
                                     fVar101 * local_228 + fVar118 * local_348 + fVar98 * local_358)
                ;
                local_270 = fVar96 * fStack_370 +
                            fVar101 * fStack_220 + fVar118 * fStack_340 + fVar98 * fStack_350;
                local_264 = (int)local_240;
                local_260 = (int)local_360;
                local_25c = (args.context)->instID[0];
                local_258 = (args.context)->instPrimID[0];
                local_43c = -1;
                args.valid = &local_43c;
                args.geometryUserPtr = pGVar8->userPtr;
                args.ray = (RTCRayN *)local_3b0;
                args.hit = (RTCHitN *)&local_278;
                args.N = 1;
                if ((pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*pGVar8->occlusionFilterN)(&args), *args.valid != 0)) {
                  p_Var33 = context->args->filter;
                  if ((p_Var33 == (RTCFilterFunctionN)0x0) ||
                     ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar8->field_8).field_0x2 & 0x40) == 0)
                       ) || ((*p_Var33)(&args), p_Var33 = (RTCFilterFunctionN)args.valid,
                            *args.valid != 0)))) {
                    bVar36 = true;
                    fStack_3a4 = fStack_3a4;
                    fStack_3a0 = fStack_3a0;
                    fStack_39c = fStack_39c;
                    goto LAB_00303e5d;
                  }
                }
                local_3b0->tfar = (float)local_3f8._0_4_;
                uVar37 = uVar37 ^ 1L << (local_3e8 & 0x3f);
                local_3e8 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> local_3e8 & 1) == 0; local_3e8 = local_3e8 + 1) {
                  }
                }
              }
              bVar36 = false;
              p_Var33 = (RTCFilterFunctionN)0x0;
              fStack_3a4 = fStack_3a4;
              fStack_3a0 = fStack_3a0;
              fStack_39c = fStack_39c;
            }
            goto LAB_00303e5d;
          }
        }
        bVar36 = false;
      }
    }
LAB_00303e5d:
    uVar42 = SUB84(p_Var33,0);
    if (4 < iVar7) {
      fVar96 = 1.0 / local_238;
      fStack_2e4 = local_2e8;
      fStack_2e0 = local_2e8;
      fStack_2dc = local_2e8;
      uVar37 = local_360;
      for (lVar38 = 4; uVar42 = SUB84(p_Var33,0), lVar38 < iVar7; lVar38 = lVar38 + 4) {
        bhit.i = (int)lVar38;
        pfVar1 = (float *)(catmullrom_basis0 + lVar38 * 4 + lVar39);
        local_338 = *pfVar1;
        fStack_334 = pfVar1[1];
        fStack_330 = pfVar1[2];
        fStack_32c = pfVar1[3];
        pfVar1 = (float *)(lVar39 + 0x22047f0 + lVar38 * 4);
        fVar98 = *pfVar1;
        fVar101 = pfVar1[1];
        fVar118 = pfVar1[2];
        fVar120 = pfVar1[3];
        pfVar1 = (float *)(lVar39 + 0x2204c74 + lVar38 * 4);
        local_238 = *pfVar1;
        fStack_234 = pfVar1[1];
        fStack_230 = pfVar1[2];
        fStack_22c = pfVar1[3];
        pfVar1 = (float *)(lVar39 + 0x22050f8 + lVar38 * 4);
        fVar123 = *pfVar1;
        fVar135 = pfVar1[1];
        fVar136 = pfVar1[2];
        fVar173 = pfVar1[3];
        fVar212 = local_218 * local_338 +
                  fVar137 * fVar98 + local_3d8 * local_238 + fVar107 * fVar123;
        fVar218 = fStack_214 * fStack_334 +
                  fVar137 * fVar101 + fStack_3d4 * fStack_234 + fVar107 * fVar135;
        fVar219 = fStack_210 * fStack_330 +
                  fVar137 * fVar118 + fStack_3d0 * fStack_230 + fVar107 * fVar136;
        fVar220 = fStack_20c * fStack_32c +
                  fVar137 * fVar120 + fStack_3cc * fStack_22c + fVar107 * fVar173;
        local_1c8 = local_1a8 * local_338 +
                    local_198 * fVar98 + local_3c8 * local_238 + fVar109 * fVar123;
        fStack_1c4 = fStack_1a4 * fStack_334 +
                     fStack_194 * fVar101 + fStack_3c4 * fStack_234 + fVar109 * fVar135;
        fStack_1c0 = fStack_1a0 * fStack_330 +
                     fStack_190 * fVar118 + fStack_3c0 * fStack_230 + fVar109 * fVar136;
        fStack_1bc = fStack_19c * fStack_32c +
                     fStack_18c * fVar120 + fStack_3bc * fStack_22c + fVar109 * fVar173;
        local_3f8._0_4_ =
             local_188 * local_338 + local_178 * fVar98 + local_168 * local_238 + fVar108 * fVar123;
        local_3f8._4_4_ =
             fStack_184 * fStack_334 +
             fStack_174 * fVar101 + fStack_164 * fStack_234 + fVar108 * fVar135;
        local_3f8._8_4_ =
             fStack_180 * fStack_330 +
             fStack_170 * fVar118 + fStack_160 * fStack_230 + fVar108 * fVar136;
        local_3f8._12_4_ =
             fStack_17c * fStack_32c +
             fStack_16c * fVar120 + fStack_15c * fStack_22c + fVar108 * fVar173;
        p_Var33 = (RTCFilterFunctionN)(catmullrom_basis1 + lVar39);
        pfVar1 = (float *)(p_Var33 + lVar38 * 4);
        fVar161 = *pfVar1;
        fVar168 = pfVar1[1];
        fVar170 = pfVar1[2];
        fVar179 = pfVar1[3];
        pfVar1 = (float *)(lVar39 + 0x2206c10 + lVar38 * 4);
        fVar159 = *pfVar1;
        fVar160 = pfVar1[1];
        fVar182 = pfVar1[2];
        fVar187 = pfVar1[3];
        pfVar1 = (float *)(lVar39 + 0x2207094 + lVar38 * 4);
        fVar193 = *pfVar1;
        fVar194 = pfVar1[1];
        fVar195 = pfVar1[2];
        fVar197 = pfVar1[3];
        pfVar1 = (float *)(lVar39 + 0x2207518 + lVar38 * 4);
        fVar198 = *pfVar1;
        fVar199 = pfVar1[1];
        fVar200 = pfVar1[2];
        fVar201 = pfVar1[3];
        local_1b8 = local_218 * fVar161 +
                    fVar137 * fVar159 + local_3d8 * fVar193 + fVar107 * fVar198;
        fStack_1b4 = fStack_214 * fVar168 +
                     fVar137 * fVar160 + fStack_3d4 * fVar194 + fVar107 * fVar199;
        fStack_1b0 = fStack_210 * fVar170 +
                     fVar137 * fVar182 + fStack_3d0 * fVar195 + fVar107 * fVar200;
        fStack_1ac = fStack_20c * fVar179 +
                     fVar137 * fVar187 + fStack_3cc * fVar197 + fVar107 * fVar201;
        fVar183 = local_1a8 * fVar161 +
                  local_198 * fVar159 + local_3c8 * fVar193 + fVar109 * fVar198;
        fVar185 = fStack_1a4 * fVar168 +
                  fStack_194 * fVar160 + fStack_3c4 * fVar194 + fVar109 * fVar199;
        fVar230 = fStack_1a0 * fVar170 +
                  fStack_190 * fVar182 + fStack_3c0 * fVar195 + fVar109 * fVar200;
        fVar232 = fStack_19c * fVar179 +
                  fStack_18c * fVar187 + fStack_3bc * fVar197 + fVar109 * fVar201;
        local_388._0_4_ =
             local_188 * fVar161 + local_178 * fVar159 + local_168 * fVar193 + fVar108 * fVar198;
        local_388._4_4_ =
             fStack_184 * fVar168 + fStack_174 * fVar160 + fStack_164 * fVar194 + fVar108 * fVar199;
        fStack_380 = fStack_180 * fVar170 +
                     fStack_170 * fVar182 + fStack_160 * fVar195 + fVar108 * fVar200;
        register0x0000154c =
             fStack_17c * fVar179 + fStack_16c * fVar187 + fStack_15c * fVar197 + fVar108 * fVar201;
        fVar221 = local_1b8 - fVar212;
        fVar226 = fStack_1b4 - fVar218;
        fVar227 = fStack_1b0 - fVar219;
        fVar169 = fStack_1ac - fVar220;
        fVar202 = fVar183 - local_1c8;
        fVar206 = fVar185 - fStack_1c4;
        fVar208 = fVar230 - fStack_1c0;
        fVar210 = fVar232 - fStack_1bc;
        fVar171 = local_1c8 * fVar221 - fVar212 * fVar202;
        fVar172 = fStack_1c4 * fVar226 - fVar218 * fVar206;
        fVar174 = fStack_1c0 * fVar227 - fVar219 * fVar208;
        fVar180 = fStack_1bc * fVar169 - fVar220 * fVar210;
        auVar60 = maxps(local_3f8,_local_388);
        bVar29 = fVar171 * fVar171 <=
                 auVar60._0_4_ * auVar60._0_4_ * (fVar221 * fVar221 + fVar202 * fVar202) &&
                 bhit.i < iVar7;
        auVar216._0_4_ = -(uint)bVar29;
        bVar28 = (int)(bhit.i | 1U) < iVar7 &&
                 fVar172 * fVar172 <=
                 auVar60._4_4_ * auVar60._4_4_ * (fVar226 * fVar226 + fVar206 * fVar206);
        auVar216._4_4_ = -(uint)bVar28;
        bVar30 = fVar174 * fVar174 <=
                 auVar60._8_4_ * auVar60._8_4_ * (fVar227 * fVar227 + fVar208 * fVar208) &&
                 (int)(bhit.i | 2U) < iVar7;
        auVar216._8_4_ = -(uint)bVar30;
        bVar31 = fVar180 * fVar180 <=
                 auVar60._12_4_ * auVar60._12_4_ * (fVar169 * fVar169 + fVar210 * fVar210) &&
                 (int)(bhit.i | 3U) < iVar7;
        auVar216._12_4_ = -(uint)bVar31;
        iVar32 = movmskps(iVar7,auVar216);
        if (iVar32 != 0) {
          fVar86 = fVar198 * local_3a8 + fVar193 * local_1f8 + fVar159 * local_318 +
                   fVar161 * local_398;
          fVar88 = fVar199 * fStack_3a4 + fVar194 * fStack_1f4 + fVar160 * fStack_314 +
                   fVar168 * fStack_394;
          fVar97 = fVar200 * fStack_3a0 + fVar195 * fStack_1f0 + fVar182 * fStack_310 +
                   fVar170 * fStack_390;
          fVar99 = fVar201 * fStack_39c + fVar197 * fStack_1ec + fVar187 * fStack_30c +
                   fVar179 * fStack_38c;
          fVar122 = fVar123 * local_3a8 + local_238 * local_1f8 + fVar98 * local_318 +
                    local_338 * local_398;
          fVar175 = fVar135 * fStack_3a4 + fStack_234 * fStack_1f4 + fVar101 * fStack_314 +
                    fStack_334 * fStack_394;
          fVar181 = fVar136 * fStack_3a0 + fStack_230 * fStack_1f0 + fVar118 * fStack_310 +
                    fStack_330 * fStack_390;
          fVar184 = fVar173 * fStack_39c + fStack_22c * fStack_1ec + fVar120 * fStack_30c +
                    fStack_32c * fStack_38c;
          pfVar1 = (float *)(lVar39 + 0x220557c + lVar38 * 4);
          fVar98 = *pfVar1;
          fVar101 = pfVar1[1];
          fVar118 = pfVar1[2];
          fVar120 = pfVar1[3];
          pfVar1 = (float *)(lVar39 + 0x2205a00 + lVar38 * 4);
          fVar123 = *pfVar1;
          fVar135 = pfVar1[1];
          fVar136 = pfVar1[2];
          fVar173 = pfVar1[3];
          pfVar1 = (float *)(lVar39 + 0x2205e84 + lVar38 * 4);
          fVar161 = *pfVar1;
          fVar168 = pfVar1[1];
          fVar170 = pfVar1[2];
          fVar179 = pfVar1[3];
          pfVar1 = (float *)(lVar39 + 0x2206308 + lVar38 * 4);
          fVar159 = *pfVar1;
          fVar160 = pfVar1[1];
          fVar182 = pfVar1[2];
          fVar187 = pfVar1[3];
          fVar186 = local_218 * fVar98 + fVar137 * fVar123 + local_3d8 * fVar161 + fVar107 * fVar159
          ;
          fVar203 = fStack_214 * fVar101 +
                    fVar137 * fVar135 + fStack_3d4 * fVar168 + fVar107 * fVar160;
          fVar207 = fStack_210 * fVar118 +
                    fVar137 * fVar136 + fStack_3d0 * fVar170 + fVar107 * fVar182;
          fVar209 = fStack_20c * fVar120 +
                    fVar137 * fVar173 + fStack_3cc * fVar179 + fVar107 * fVar187;
          fVar100 = local_1a8 * fVar98 +
                    local_198 * fVar123 + local_3c8 * fVar161 + fVar109 * fVar159;
          fVar110 = fStack_1a4 * fVar101 +
                    fStack_194 * fVar135 + fStack_3c4 * fVar168 + fVar109 * fVar160;
          fVar119 = fStack_1a0 * fVar118 +
                    fStack_190 * fVar136 + fStack_3c0 * fVar170 + fVar109 * fVar182;
          fVar121 = fStack_19c * fVar120 +
                    fStack_18c * fVar173 + fStack_3bc * fVar179 + fVar109 * fVar187;
          pfVar1 = (float *)(lVar39 + 0x220799c + lVar38 * 4);
          fVar193 = *pfVar1;
          fVar194 = pfVar1[1];
          fVar195 = pfVar1[2];
          fVar197 = pfVar1[3];
          pfVar1 = (float *)(lVar39 + 0x22082a4 + lVar38 * 4);
          fVar198 = *pfVar1;
          fVar199 = pfVar1[1];
          fVar200 = pfVar1[2];
          fVar201 = pfVar1[3];
          pfVar1 = (float *)(lVar39 + 0x2208728 + lVar38 * 4);
          fVar171 = *pfVar1;
          fVar172 = pfVar1[1];
          fVar174 = pfVar1[2];
          fVar180 = pfVar1[3];
          pfVar1 = (float *)(lVar39 + 0x2207e20 + lVar38 * 4);
          fVar235 = *pfVar1;
          fVar238 = pfVar1[1];
          fVar83 = pfVar1[2];
          fVar85 = pfVar1[3];
          fVar211 = local_218 * fVar193 +
                    fVar137 * fVar235 + local_3d8 * fVar198 + fVar107 * fVar171;
          fVar231 = fStack_214 * fVar194 +
                    fVar137 * fVar238 + fStack_3d4 * fVar199 + fVar107 * fVar172;
          fVar233 = fStack_210 * fVar195 +
                    fVar137 * fVar83 + fStack_3d0 * fVar200 + fVar107 * fVar174;
          fVar236 = fStack_20c * fVar197 +
                    fVar137 * fVar85 + fStack_3cc * fVar201 + fVar107 * fVar180;
          fVar239 = local_1a8 * fVar193 +
                    local_198 * fVar235 + local_3c8 * fVar198 + fVar109 * fVar171;
          fVar234 = fStack_1a4 * fVar194 +
                    fStack_194 * fVar238 + fStack_3c4 * fVar199 + fVar109 * fVar172;
          fVar237 = fStack_1a0 * fVar195 +
                    fStack_190 * fVar83 + fStack_3c0 * fVar200 + fVar109 * fVar174;
          fVar240 = fStack_19c * fVar197 +
                    fStack_18c * fVar85 + fStack_3bc * fVar201 + fVar109 * fVar180;
          auVar217._0_8_ = CONCAT44(fVar203,fVar186) & 0x7fffffff7fffffff;
          auVar217._8_4_ = ABS(fVar207);
          auVar217._12_4_ = ABS(fVar209);
          auVar156._0_8_ = CONCAT44(fVar110,fVar100) & 0x7fffffff7fffffff;
          auVar156._8_4_ = ABS(fVar119);
          auVar156._12_4_ = ABS(fVar121);
          auVar60 = maxps(auVar217,auVar156);
          auVar224._0_8_ =
               CONCAT44(fVar101 * fStack_394 +
                        fVar135 * fStack_314 + fVar168 * fStack_1f4 + fVar160 * fStack_3a4,
                        fVar98 * local_398 +
                        fVar123 * local_318 + fVar161 * local_1f8 + fVar159 * local_3a8) &
               0x7fffffff7fffffff;
          auVar224._8_4_ =
               ABS(fVar118 * fStack_390 +
                   fVar136 * fStack_310 + fVar170 * fStack_1f0 + fVar182 * fStack_3a0);
          auVar224._12_4_ =
               ABS(fVar120 * fStack_38c +
                   fVar173 * fStack_30c + fVar179 * fStack_1ec + fVar187 * fStack_39c);
          auVar60 = maxps(auVar60,auVar224);
          uVar43 = -(uint)(local_2e8 <= auVar60._0_4_);
          uVar44 = -(uint)(fStack_2e4 <= auVar60._4_4_);
          uVar45 = -(uint)(fStack_2e0 <= auVar60._8_4_);
          uVar46 = -(uint)(fStack_2dc <= auVar60._12_4_);
          auVar157._0_4_ = ~uVar43 & (uint)fVar221;
          auVar157._4_4_ = ~uVar44 & (uint)fVar226;
          auVar157._8_4_ = ~uVar45 & (uint)fVar227;
          auVar157._12_4_ = ~uVar46 & (uint)fVar169;
          auVar205._0_4_ = (uint)fVar186 & uVar43;
          auVar205._4_4_ = (uint)fVar203 & uVar44;
          auVar205._8_4_ = (uint)fVar207 & uVar45;
          auVar205._12_4_ = (uint)fVar209 & uVar46;
          auVar205 = auVar205 | auVar157;
          fVar168 = (float)(~uVar43 & (uint)fVar202 | (uint)fVar100 & uVar43);
          fVar179 = (float)(~uVar44 & (uint)fVar206 | (uint)fVar110 & uVar44);
          fVar100 = (float)(~uVar45 & (uint)fVar208 | (uint)fVar119 & uVar45);
          fVar110 = (float)(~uVar46 & (uint)fVar210 | (uint)fVar121 & uVar46);
          auVar225._0_8_ = CONCAT44(fVar231,fVar211) & 0x7fffffff7fffffff;
          auVar225._8_4_ = ABS(fVar233);
          auVar225._12_4_ = ABS(fVar236);
          auVar104._0_8_ = CONCAT44(fVar234,fVar239) & 0x7fffffff7fffffff;
          auVar104._8_4_ = ABS(fVar237);
          auVar104._12_4_ = ABS(fVar240);
          auVar60 = maxps(auVar225,auVar104);
          auVar79._0_8_ =
               CONCAT44(fVar194 * fStack_394 +
                        fVar238 * fStack_314 + fVar199 * fStack_1f4 + fVar172 * fStack_3a4,
                        fVar193 * local_398 +
                        fVar235 * local_318 + fVar198 * local_1f8 + fVar171 * local_3a8) &
               0x7fffffff7fffffff;
          auVar79._8_4_ =
               ABS(fVar195 * fStack_390 +
                   fVar83 * fStack_310 + fVar200 * fStack_1f0 + fVar174 * fStack_3a0);
          auVar79._12_4_ =
               ABS(fVar197 * fStack_38c +
                   fVar85 * fStack_30c + fVar201 * fStack_1ec + fVar180 * fStack_39c);
          auVar60 = maxps(auVar60,auVar79);
          uVar43 = -(uint)(local_2e8 <= auVar60._0_4_);
          uVar44 = -(uint)(fStack_2e4 <= auVar60._4_4_);
          uVar45 = -(uint)(fStack_2e0 <= auVar60._8_4_);
          uVar46 = -(uint)(fStack_2dc <= auVar60._12_4_);
          fVar171 = (float)((uint)fVar211 & uVar43 | ~uVar43 & (uint)fVar221);
          fVar172 = (float)((uint)fVar231 & uVar44 | ~uVar44 & (uint)fVar226);
          fVar174 = (float)((uint)fVar233 & uVar45 | ~uVar45 & (uint)fVar227);
          fVar180 = (float)((uint)fVar236 & uVar46 | ~uVar46 & (uint)fVar169);
          fVar193 = (float)(~uVar43 & (uint)fVar202 | (uint)fVar239 & uVar43);
          fVar195 = (float)(~uVar44 & (uint)fVar206 | (uint)fVar234 & uVar44);
          fVar198 = (float)(~uVar45 & (uint)fVar208 | (uint)fVar237 & uVar45);
          fVar200 = (float)(~uVar46 & (uint)fVar210 | (uint)fVar240 & uVar46);
          fVar173 = auVar205._0_4_;
          fVar98 = auVar205._4_4_;
          fVar101 = auVar205._8_4_;
          fVar118 = auVar205._12_4_;
          auVar131._0_4_ = fVar168 * fVar168 + fVar173 * fVar173;
          auVar131._4_4_ = fVar179 * fVar179 + fVar98 * fVar98;
          auVar131._8_4_ = fVar100 * fVar100 + fVar101 * fVar101;
          auVar131._12_4_ = fVar110 * fVar110 + fVar118 * fVar118;
          auVar60 = rsqrtps(auVar157,auVar131);
          fVar120 = auVar60._0_4_;
          fVar123 = auVar60._4_4_;
          fVar135 = auVar60._8_4_;
          fVar136 = auVar60._12_4_;
          auVar158._0_4_ = fVar120 * fVar120 * auVar131._0_4_ * 0.5 * fVar120;
          auVar158._4_4_ = fVar123 * fVar123 * auVar131._4_4_ * 0.5 * fVar123;
          auVar158._8_4_ = fVar135 * fVar135 * auVar131._8_4_ * 0.5 * fVar135;
          auVar158._12_4_ = fVar136 * fVar136 * auVar131._12_4_ * 0.5 * fVar136;
          fVar159 = fVar120 * 1.5 - auVar158._0_4_;
          fVar160 = fVar123 * 1.5 - auVar158._4_4_;
          fVar182 = fVar135 * 1.5 - auVar158._8_4_;
          fVar187 = fVar136 * 1.5 - auVar158._12_4_;
          auVar132._0_4_ = fVar193 * fVar193 + fVar171 * fVar171;
          auVar132._4_4_ = fVar195 * fVar195 + fVar172 * fVar172;
          auVar132._8_4_ = fVar198 * fVar198 + fVar174 * fVar174;
          auVar132._12_4_ = fVar200 * fVar200 + fVar180 * fVar180;
          auVar60 = rsqrtps(auVar158,auVar132);
          fVar120 = auVar60._0_4_;
          fVar123 = auVar60._4_4_;
          fVar135 = auVar60._8_4_;
          fVar136 = auVar60._12_4_;
          fVar161 = fVar120 * 1.5 - fVar120 * fVar120 * auVar132._0_4_ * 0.5 * fVar120;
          fVar123 = fVar123 * 1.5 - fVar123 * fVar123 * auVar132._4_4_ * 0.5 * fVar123;
          fVar170 = fVar135 * 1.5 - fVar135 * fVar135 * auVar132._8_4_ * 0.5 * fVar135;
          fVar136 = fVar136 * 1.5 - fVar136 * fVar136 * auVar132._12_4_ * 0.5 * fVar136;
          fVar202 = fVar168 * fVar159 * (float)local_3f8._0_4_;
          fVar206 = fVar179 * fVar160 * local_3f8._4_4_;
          fVar208 = fVar100 * fVar182 * local_3f8._8_4_;
          fVar210 = fVar110 * fVar187 * local_3f8._12_4_;
          fVar135 = -fVar173 * fVar159 * (float)local_3f8._0_4_;
          fVar173 = -fVar98 * fVar160 * local_3f8._4_4_;
          fVar168 = -fVar101 * fVar182 * local_3f8._8_4_;
          fVar179 = -fVar118 * fVar187 * local_3f8._12_4_;
          fVar194 = fVar159 * 0.0 * (float)local_3f8._0_4_;
          fVar197 = fVar160 * 0.0 * local_3f8._4_4_;
          fVar199 = fVar182 * 0.0 * local_3f8._8_4_;
          fVar201 = fVar187 * 0.0 * local_3f8._12_4_;
          local_328 = fVar122 + fVar194;
          fStack_324 = fVar175 + fVar197;
          fStack_320 = fVar181 + fVar199;
          fStack_31c = fVar184 + fVar201;
          fVar100 = fVar193 * fVar161 * (float)local_388._0_4_;
          fVar110 = fVar195 * fVar123 * (float)local_388._4_4_;
          fVar119 = fVar198 * fVar170 * fStack_380;
          fVar121 = fVar200 * fVar136 * register0x0000154c;
          fVar221 = local_1b8 + fVar100;
          fVar226 = fStack_1b4 + fVar110;
          fVar227 = fStack_1b0 + fVar119;
          fVar169 = fStack_1ac + fVar121;
          fVar98 = -fVar171 * fVar161 * (float)local_388._0_4_;
          fVar101 = -fVar172 * fVar123 * (float)local_388._4_4_;
          fVar118 = -fVar174 * fVar170 * fStack_380;
          fVar120 = -fVar180 * fVar136 * register0x0000154c;
          fVar171 = fVar183 + fVar98;
          fVar172 = fVar185 + fVar101;
          fVar174 = fVar230 + fVar118;
          fVar180 = fVar232 + fVar120;
          fVar159 = fVar161 * 0.0 * (float)local_388._0_4_;
          fVar160 = fVar123 * 0.0 * (float)local_388._4_4_;
          fVar182 = fVar170 * 0.0 * fStack_380;
          fVar187 = fVar136 * 0.0 * register0x0000154c;
          fVar123 = fVar212 - fVar202;
          fVar136 = fVar218 - fVar206;
          fVar161 = fVar219 - fVar208;
          fVar170 = fVar220 - fVar210;
          fVar235 = fVar86 + fVar159;
          fVar238 = fVar88 + fVar160;
          fVar83 = fVar97 + fVar182;
          fVar85 = fVar99 + fVar187;
          fVar193 = local_1c8 - fVar135;
          fVar195 = fStack_1c4 - fVar173;
          fVar198 = fStack_1c0 - fVar168;
          fVar200 = fStack_1bc - fVar179;
          fVar122 = fVar122 - fVar194;
          fVar175 = fVar175 - fVar197;
          fVar181 = fVar181 - fVar199;
          fVar184 = fVar184 - fVar201;
          uVar43 = -(uint)(0.0 < (fVar193 * (fVar235 - fVar122) - fVar122 * (fVar171 - fVar193)) *
                                 0.0 + (fVar122 * (fVar221 - fVar123) -
                                       (fVar235 - fVar122) * fVar123) * 0.0 +
                                       ((fVar171 - fVar193) * fVar123 -
                                       (fVar221 - fVar123) * fVar193));
          uVar44 = -(uint)(0.0 < (fVar195 * (fVar238 - fVar175) - fVar175 * (fVar172 - fVar195)) *
                                 0.0 + (fVar175 * (fVar226 - fVar136) -
                                       (fVar238 - fVar175) * fVar136) * 0.0 +
                                       ((fVar172 - fVar195) * fVar136 -
                                       (fVar226 - fVar136) * fVar195));
          uVar45 = -(uint)(0.0 < (fVar198 * (fVar83 - fVar181) - fVar181 * (fVar174 - fVar198)) *
                                 0.0 + (fVar181 * (fVar227 - fVar161) - (fVar83 - fVar181) * fVar161
                                       ) * 0.0 + ((fVar174 - fVar198) * fVar161 -
                                                 (fVar227 - fVar161) * fVar198));
          uVar46 = -(uint)(0.0 < (fVar200 * (fVar85 - fVar184) - fVar184 * (fVar180 - fVar200)) *
                                 0.0 + (fVar184 * (fVar169 - fVar170) - (fVar85 - fVar184) * fVar170
                                       ) * 0.0 + ((fVar180 - fVar200) * fVar170 -
                                                 (fVar169 - fVar170) * fVar200));
          fVar212 = (float)((uint)(local_1b8 - fVar100) & uVar43 |
                           ~uVar43 & (uint)(fVar212 + fVar202));
          fVar218 = (float)((uint)(fStack_1b4 - fVar110) & uVar44 |
                           ~uVar44 & (uint)(fVar218 + fVar206));
          fVar219 = (float)((uint)(fStack_1b0 - fVar119) & uVar45 |
                           ~uVar45 & (uint)(fVar219 + fVar208));
          fVar220 = (float)((uint)(fStack_1ac - fVar121) & uVar46 |
                           ~uVar46 & (uint)(fVar220 + fVar210));
          fVar100 = (float)((uint)(fVar183 - fVar98) & uVar43 |
                           ~uVar43 & (uint)(local_1c8 + fVar135));
          fVar110 = (float)((uint)(fVar185 - fVar101) & uVar44 |
                           ~uVar44 & (uint)(fStack_1c4 + fVar173));
          fStack_3e0 = (float)((uint)(fVar230 - fVar118) & uVar45 |
                              ~uVar45 & (uint)(fStack_1c0 + fVar168));
          fStack_3dc = (float)((uint)(fVar232 - fVar120) & uVar46 |
                              ~uVar46 & (uint)(fStack_1bc + fVar179));
          fVar202 = (float)((uint)(fVar86 - fVar159) & uVar43 | ~uVar43 & (uint)local_328);
          fVar206 = (float)((uint)(fVar88 - fVar160) & uVar44 | ~uVar44 & (uint)fStack_324);
          fVar208 = (float)((uint)(fVar97 - fVar182) & uVar45 | ~uVar45 & (uint)fStack_320);
          fVar210 = (float)((uint)(fVar99 - fVar187) & uVar46 | ~uVar46 & (uint)fStack_31c);
          fVar135 = (float)((uint)fVar123 & uVar43 | ~uVar43 & (uint)fVar221);
          fVar173 = (float)((uint)fVar136 & uVar44 | ~uVar44 & (uint)fVar226);
          fVar168 = (float)((uint)fVar161 & uVar45 | ~uVar45 & (uint)fVar227);
          fVar179 = (float)((uint)fVar170 & uVar46 | ~uVar46 & (uint)fVar169);
          fVar194 = (float)((uint)fVar193 & uVar43 | ~uVar43 & (uint)fVar171);
          fVar197 = (float)((uint)fVar195 & uVar44 | ~uVar44 & (uint)fVar172);
          fVar199 = (float)((uint)fVar198 & uVar45 | ~uVar45 & (uint)fVar174);
          fVar201 = (float)((uint)fVar200 & uVar46 | ~uVar46 & (uint)fVar180);
          fVar159 = (float)((uint)fVar122 & uVar43 | ~uVar43 & (uint)fVar235);
          fVar160 = (float)((uint)fVar175 & uVar44 | ~uVar44 & (uint)fVar238);
          fVar182 = (float)((uint)fVar181 & uVar45 | ~uVar45 & (uint)fVar83);
          fVar187 = (float)((uint)fVar184 & uVar46 | ~uVar46 & (uint)fVar85);
          fVar221 = (float)((uint)fVar221 & uVar43 | ~uVar43 & (uint)fVar123) - fVar212;
          fVar226 = (float)((uint)fVar226 & uVar44 | ~uVar44 & (uint)fVar136) - fVar218;
          fVar227 = (float)((uint)fVar227 & uVar45 | ~uVar45 & (uint)fVar161) - fVar219;
          fVar169 = (float)((uint)fVar169 & uVar46 | ~uVar46 & (uint)fVar170) - fVar220;
          fVar193 = (float)((uint)fVar171 & uVar43 | ~uVar43 & (uint)fVar193) - fVar100;
          fVar195 = (float)((uint)fVar172 & uVar44 | ~uVar44 & (uint)fVar195) - fVar110;
          fVar198 = (float)((uint)fVar174 & uVar45 | ~uVar45 & (uint)fVar198) - fStack_3e0;
          fVar200 = (float)((uint)fVar180 & uVar46 | ~uVar46 & (uint)fVar200) - fStack_3dc;
          fVar171 = (float)((uint)fVar235 & uVar43 | ~uVar43 & (uint)fVar122) - fVar202;
          fVar172 = (float)((uint)fVar238 & uVar44 | ~uVar44 & (uint)fVar175) - fVar206;
          fVar174 = (float)((uint)fVar83 & uVar45 | ~uVar45 & (uint)fVar181) - fVar208;
          fVar180 = (float)((uint)fVar85 & uVar46 | ~uVar46 & (uint)fVar184) - fVar210;
          fVar235 = fVar212 - fVar135;
          fVar238 = fVar218 - fVar173;
          fVar83 = fVar219 - fVar168;
          fVar85 = fVar220 - fVar179;
          fVar98 = fVar100 - fVar194;
          fVar101 = fVar110 - fVar197;
          fVar118 = fStack_3e0 - fVar199;
          fVar120 = fStack_3dc - fVar201;
          fVar123 = fVar202 - fVar159;
          fVar136 = fVar206 - fVar160;
          fVar161 = fVar208 - fVar182;
          fVar170 = fVar210 - fVar187;
          fVar183 = (fVar100 * fVar171 - fVar202 * fVar193) * 0.0 +
                    (fVar202 * fVar221 - fVar212 * fVar171) * 0.0 +
                    (fVar212 * fVar193 - fVar100 * fVar221);
          fVar185 = (fVar110 * fVar172 - fVar206 * fVar195) * 0.0 +
                    (fVar206 * fVar226 - fVar218 * fVar172) * 0.0 +
                    (fVar218 * fVar195 - fVar110 * fVar226);
          auVar116._4_4_ = fVar185;
          auVar116._0_4_ = fVar183;
          fVar230 = (fStack_3e0 * fVar174 - fVar208 * fVar198) * 0.0 +
                    (fVar208 * fVar227 - fVar219 * fVar174) * 0.0 +
                    (fVar219 * fVar198 - fStack_3e0 * fVar227);
          fVar232 = (fStack_3dc * fVar180 - fVar210 * fVar200) * 0.0 +
                    (fVar210 * fVar169 - fVar220 * fVar180) * 0.0 +
                    (fVar220 * fVar200 - fStack_3dc * fVar169);
          auVar229._0_4_ =
               (fVar194 * fVar123 - fVar159 * fVar98) * 0.0 +
               (fVar159 * fVar235 - fVar135 * fVar123) * 0.0 +
               (fVar135 * fVar98 - fVar194 * fVar235);
          auVar229._4_4_ =
               (fVar197 * fVar136 - fVar160 * fVar101) * 0.0 +
               (fVar160 * fVar238 - fVar173 * fVar136) * 0.0 +
               (fVar173 * fVar101 - fVar197 * fVar238);
          auVar229._8_4_ =
               (fVar199 * fVar161 - fVar182 * fVar118) * 0.0 +
               (fVar182 * fVar83 - fVar168 * fVar161) * 0.0 + (fVar168 * fVar118 - fVar199 * fVar83)
          ;
          auVar229._12_4_ =
               (fVar201 * fVar170 - fVar187 * fVar120) * 0.0 +
               (fVar187 * fVar85 - fVar179 * fVar170) * 0.0 + (fVar179 * fVar120 - fVar201 * fVar85)
          ;
          auVar116._8_4_ = fVar230;
          auVar116._12_4_ = fVar232;
          auVar60 = maxps(auVar116,auVar229);
          bVar29 = auVar60._0_4_ <= 0.0 && bVar29;
          auVar117._0_4_ = -(uint)bVar29;
          bVar28 = auVar60._4_4_ <= 0.0 && bVar28;
          auVar117._4_4_ = -(uint)bVar28;
          bVar30 = auVar60._8_4_ <= 0.0 && bVar30;
          auVar117._8_4_ = -(uint)bVar30;
          bVar31 = auVar60._12_4_ <= 0.0 && bVar31;
          auVar117._12_4_ = -(uint)bVar31;
          iVar32 = movmskps((int)p_Var33,auVar117);
          if (iVar32 == 0) {
LAB_00304d67:
            iVar32 = 0;
            auVar106._8_8_ = uStack_2f0;
            auVar106._0_8_ = local_2f8;
          }
          else {
            fVar135 = local_3b0->tfar;
            fVar168 = fVar98 * fVar171 - fVar123 * fVar193;
            fVar179 = fVar101 * fVar172 - fVar136 * fVar195;
            fVar159 = fVar118 * fVar174 - fVar161 * fVar198;
            fVar160 = fVar120 * fVar180 - fVar170 * fVar200;
            fVar123 = fVar123 * fVar221 - fVar171 * fVar235;
            fVar136 = fVar136 * fVar226 - fVar172 * fVar238;
            fVar173 = fVar161 * fVar227 - fVar174 * fVar83;
            fVar161 = fVar170 * fVar169 - fVar180 * fVar85;
            fVar170 = fVar235 * fVar193 - fVar98 * fVar221;
            fVar182 = fVar238 * fVar195 - fVar101 * fVar226;
            fVar187 = fVar83 * fVar198 - fVar118 * fVar227;
            fVar193 = fVar85 * fVar200 - fVar120 * fVar169;
            auVar105._0_4_ = fVar123 * 0.0 + fVar170;
            auVar105._4_4_ = fVar136 * 0.0 + fVar182;
            auVar105._8_4_ = fVar173 * 0.0 + fVar187;
            auVar105._12_4_ = fVar161 * 0.0 + fVar193;
            auVar166._0_4_ = fVar168 * 0.0 + auVar105._0_4_;
            auVar166._4_4_ = fVar179 * 0.0 + auVar105._4_4_;
            auVar166._8_4_ = fVar159 * 0.0 + auVar105._8_4_;
            auVar166._12_4_ = fVar160 * 0.0 + auVar105._12_4_;
            auVar60 = rcpps(auVar105,auVar166);
            fVar98 = auVar60._0_4_;
            fVar101 = auVar60._4_4_;
            fVar118 = auVar60._8_4_;
            fVar120 = auVar60._12_4_;
            fVar98 = (1.0 - auVar166._0_4_ * fVar98) * fVar98 + fVar98;
            fVar101 = (1.0 - auVar166._4_4_ * fVar101) * fVar101 + fVar101;
            fVar118 = (1.0 - auVar166._8_4_ * fVar118) * fVar118 + fVar118;
            fVar120 = (1.0 - auVar166._12_4_ * fVar120) * fVar120 + fVar120;
            fVar123 = (fVar202 * fVar170 + fVar100 * fVar123 + fVar212 * fVar168) * fVar98;
            fVar136 = (fVar206 * fVar182 + fVar110 * fVar136 + fVar218 * fVar179) * fVar101;
            aVar167.v[1] = fVar136;
            aVar167.v[0] = fVar123;
            fVar173 = (fVar208 * fVar187 + fStack_3e0 * fVar173 + fVar219 * fVar159) * fVar118;
            fVar161 = (fVar210 * fVar193 + fStack_3dc * fVar161 + fVar220 * fVar160) * fVar120;
            bVar29 = (local_208 <= fVar123 && fVar123 <= fVar135) && bVar29;
            auVar133._0_4_ = -(uint)bVar29;
            bVar28 = (fStack_204 <= fVar136 && fVar136 <= fVar135) && bVar28;
            auVar133._4_4_ = -(uint)bVar28;
            bVar30 = (fStack_200 <= fVar173 && fVar173 <= fVar135) && bVar30;
            auVar133._8_4_ = -(uint)bVar30;
            bVar31 = (fStack_1fc <= fVar161 && fVar161 <= fVar135) && bVar31;
            auVar133._12_4_ = -(uint)bVar31;
            iVar32 = movmskps(iVar32,auVar133);
            if (iVar32 == 0) goto LAB_00304d67;
            auVar134._0_8_ =
                 CONCAT44(-(uint)(auVar166._4_4_ != 0.0 && bVar28),
                          -(uint)(auVar166._0_4_ != 0.0 && bVar29));
            auVar134._8_4_ = -(uint)(auVar166._8_4_ != 0.0 && bVar30);
            auVar134._12_4_ = -(uint)(auVar166._12_4_ != 0.0 && bVar31);
            iVar32 = movmskps(iVar32,auVar134);
            auVar106._8_8_ = uStack_2f0;
            auVar106._0_8_ = local_2f8;
            if (iVar32 != 0) {
              fVar183 = fVar183 * fVar98;
              fVar185 = fVar185 * fVar101;
              fVar230 = fVar230 * fVar118;
              fVar232 = fVar232 * fVar120;
              local_408 = (float)((uint)(1.0 - fVar183) & uVar43 | ~uVar43 & (uint)fVar183);
              fStack_404 = (float)((uint)(1.0 - fVar185) & uVar44 | ~uVar44 & (uint)fVar185);
              fStack_400 = (float)((uint)(1.0 - fVar230) & uVar45 | ~uVar45 & (uint)fVar230);
              fStack_3fc = (float)((uint)(1.0 - fVar232) & uVar46 | ~uVar46 & (uint)fVar232);
              auVar106._8_4_ = auVar134._8_4_;
              auVar106._0_8_ = auVar134._0_8_;
              auVar106._12_4_ = auVar134._12_4_;
              aVar167.v[2] = fVar173;
              aVar167.v[3] = fVar161;
              local_1e8 = (float)(~uVar43 & (uint)(auVar229._0_4_ * fVar98) |
                                 (uint)(1.0 - auVar229._0_4_ * fVar98) & uVar43);
              fStack_1e4 = (float)(~uVar44 & (uint)(auVar229._4_4_ * fVar101) |
                                  (uint)(1.0 - auVar229._4_4_ * fVar101) & uVar44);
              fStack_1e0 = (float)(~uVar45 & (uint)(auVar229._8_4_ * fVar118) |
                                  (uint)(1.0 - auVar229._8_4_ * fVar118) & uVar45);
              fStack_1dc = (float)(~uVar46 & (uint)(auVar229._12_4_ * fVar120) |
                                  (uint)(1.0 - auVar229._12_4_ * fVar120) & uVar46);
              local_418 = aVar167;
            }
          }
          uVar43 = movmskps(iVar32,auVar106);
          p_Var33 = (RTCFilterFunctionN)(ulong)uVar43;
          if (uVar43 != 0) {
            fVar101 = ((float)local_388._0_4_ - (float)local_3f8._0_4_) * local_408 +
                      (float)local_3f8._0_4_;
            fVar118 = ((float)local_388._4_4_ - local_3f8._4_4_) * fStack_404 + local_3f8._4_4_;
            fVar120 = (fStack_380 - local_3f8._8_4_) * fStack_400 + local_3f8._8_4_;
            fVar123 = (register0x0000154c - local_3f8._12_4_) * fStack_3fc + local_3f8._12_4_;
            fVar98 = local_300->depth_scale;
            bhit.valid.field_0._0_4_ =
                 -(uint)(fVar98 * (fVar101 + fVar101) < local_418.v[0]) & auVar106._0_4_;
            bhit.valid.field_0._4_4_ =
                 -(uint)(fVar98 * (fVar118 + fVar118) < local_418.v[1]) & auVar106._4_4_;
            bhit.valid.field_0._8_4_ =
                 -(uint)(fVar98 * (fVar120 + fVar120) < local_418.v[2]) & auVar106._8_4_;
            bhit.valid.field_0._12_4_ =
                 -(uint)(fVar98 * (fVar123 + fVar123) < local_418.v[3]) & auVar106._12_4_;
            uVar43 = movmskps((int)local_300,(undefined1  [16])bhit.valid.field_0);
            p_Var33 = (RTCFilterFunctionN)(ulong)uVar43;
            if (uVar43 != 0) {
              local_1e8 = local_1e8 + local_1e8 + -1.0;
              fStack_1e4 = fStack_1e4 + fStack_1e4 + -1.0;
              fStack_1e0 = fStack_1e0 + fStack_1e0 + -1.0;
              fStack_1dc = fStack_1dc + fStack_1dc + -1.0;
              bhit.U.field_0.v[1] = fStack_404;
              bhit.U.field_0.v[0] = local_408;
              bhit.U.field_0.v[2] = fStack_400;
              bhit.U.field_0.v[3] = fStack_3fc;
              bhit.V.field_0.v[0] = local_1e8;
              bhit.V.field_0.v[1] = fStack_1e4;
              bhit.V.field_0.v[2] = fStack_1e0;
              bhit.V.field_0.v[3] = fStack_1dc;
              bhit.T.field_0 = local_418;
              bhit.N = iVar7;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fStack_374,local_378);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fStack_36c,fStack_370);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fStack_224,local_228);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fStack_21c,fStack_220);
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fStack_344,local_348);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fStack_33c,fStack_340);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fStack_354,local_358);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fStack_34c,fStack_350);
              pGVar8 = (context->scene->geometries).items[uVar37].ptr;
              if ((pGVar8->mask & local_3b0->mask) == 0) {
                bVar34 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar34 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar98 = (float)bhit.i;
                bhit.vu.field_0.v[0] = (fVar98 + local_408 + 0.0) * fVar96;
                bhit.vu.field_0.v[1] = (fVar98 + fStack_404 + 1.0) * fVar96;
                bhit.vu.field_0.v[2] = (fVar98 + fStack_400 + 2.0) * fVar96;
                bhit.vu.field_0.v[3] = (fVar98 + fStack_3fc + 3.0) * fVar96;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_1e4,local_1e8);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_1dc,fStack_1e0);
                bhit.vt.field_0 = local_418;
                local_3e8 = (ulong)(byte)uVar43;
                lVar35 = 0;
                if (local_3e8 != 0) {
                  for (; ((byte)uVar43 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                  }
                }
                local_248 = context;
                while (local_3e8 != 0) {
                  local_26c = bhit.vu.field_0.v[lVar35];
                  local_268 = bhit.vv.field_0.v[lVar35];
                  local_388._0_4_ = local_3b0->tfar;
                  local_3f8._0_8_ = lVar35;
                  local_3b0->tfar = bhit.vt.field_0.v[lVar35];
                  fVar98 = 1.0 - local_26c;
                  fVar118 = local_26c * 3.0;
                  fVar120 = ((fVar118 + 2.0) * (fVar98 + fVar98) + fVar98 * -3.0 * fVar98) * 0.5;
                  fVar101 = (fVar98 * -2.0 * local_26c + local_26c * local_26c) * 0.5;
                  fVar118 = (local_26c * fVar118 + (fVar118 + -5.0) * (local_26c + local_26c)) * 0.5
                  ;
                  fVar98 = (local_26c * (fVar98 + fVar98) - fVar98 * fVar98) * 0.5;
                  args.context = local_248->user;
                  local_278 = CONCAT44(fVar98 * fStack_374 +
                                       fVar118 * fStack_224 +
                                       fVar120 * fStack_344 + fVar101 * fStack_354,
                                       fVar98 * local_378 +
                                       fVar118 * local_228 +
                                       fVar120 * local_348 + fVar101 * local_358);
                  local_270 = fVar98 * fStack_370 +
                              fVar118 * fStack_220 + fVar120 * fStack_340 + fVar101 * fStack_350;
                  local_264 = (int)local_240;
                  local_260 = (int)local_360;
                  local_25c = (args.context)->instID[0];
                  local_258 = (args.context)->instPrimID[0];
                  local_43c = -1;
                  args.valid = &local_43c;
                  args.geometryUserPtr = pGVar8->userPtr;
                  args.ray = (RTCRayN *)local_3b0;
                  args.hit = (RTCHitN *)&local_278;
                  args.N = 1;
                  if ((pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar8->occlusionFilterN)(&args), *args.valid != 0)) {
                    p_Var33 = local_248->args->filter;
                    if ((p_Var33 == (RTCFilterFunctionN)0x0) ||
                       ((((local_248->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar8->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var33)(&args), p_Var33 = (RTCFilterFunctionN)args.valid,
                        *args.valid != 0)))) {
                      bVar34 = 1;
                      context = local_248;
                      goto LAB_00304cd9;
                    }
                  }
                  local_3b0->tfar = (float)local_388._0_4_;
                  local_3e8 = local_3e8 ^ 1L << (local_3f8._0_8_ & 0x3f);
                  lVar35 = 0;
                  if (local_3e8 != 0) {
                    for (; (local_3e8 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                    }
                  }
                }
                bVar34 = 0;
                p_Var33 = (RTCFilterFunctionN)0x0;
                context = local_248;
              }
LAB_00304cd9:
              bVar36 = (bool)(bVar36 | bVar34);
              uVar37 = local_360;
            }
          }
        }
      }
    }
    if (bVar36) break;
    fVar108 = local_3b0->tfar;
    auVar95._4_4_ = -(uint)(fVar82 <= fVar108);
    auVar95._0_4_ = -(uint)(fVar49 <= fVar108);
    auVar95._8_4_ = -(uint)(fVar84 <= fVar108);
    auVar95._12_4_ = -(uint)(fVar87 <= fVar108);
    uVar43 = movmskps(uVar42,auVar95);
    uVar41 = (ulong)((uint)uVar40 & uVar43);
  }
  return uVar41 != 0;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }